

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O1

void __thiscall amrex::MLCellLinOp::prepareForSolve(MLCellLinOp *this)

{
  double *pdVar1;
  __uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  _Var2;
  bool bVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  int i;
  uint uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  int *piVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  int j;
  int iVar35;
  undefined8 *puVar36;
  long lVar37;
  long *plVar38;
  uint uVar39;
  int *piVar40;
  ulong uVar41;
  uint uVar42;
  int iVar43;
  int iVar44;
  long lVar45;
  uint uVar46;
  int *piVar47;
  ulong uVar48;
  int iVar49;
  int *piVar50;
  int iVar51;
  int iVar52;
  long lVar53;
  undefined8 *puVar54;
  long *plVar55;
  uint uVar56;
  undefined8 uVar57;
  double dVar58;
  undefined8 uVar59;
  double dVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  double dVar75;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  double dVar76;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  uint uVar77;
  Long LVar78;
  int iVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  int ki;
  int ji;
  IntVect hi;
  IntVect low;
  MFIter mfi;
  MultiFab foo;
  long local_710;
  long local_6b8;
  int *local_6b0;
  Array4<double> local_698;
  Array4<double> local_658;
  ulong local_618;
  ulong local_610;
  long local_608;
  int *local_600;
  ulong local_5f8;
  ulong local_5f0;
  ulong local_5e8;
  ulong local_5e0;
  int local_5d8;
  int local_5d4;
  double *local_5d0;
  double *local_5c8;
  double *local_5c0;
  long local_5b8;
  long local_5b0;
  Array4<const_int> local_5a8;
  long local_568;
  long local_560;
  uint local_554;
  Array4<const_int> local_550;
  ulong local_510;
  undefined1 local_508 [16];
  undefined1 local_4f8 [8];
  undefined8 uStack_4f0;
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  double *local_4a8;
  ulong local_4a0;
  uint local_498;
  int local_494;
  int local_490;
  int local_48c;
  Array4<const_double> local_488;
  undefined1 local_448 [16];
  double local_430 [4];
  ulong local_410;
  long local_408;
  long local_400;
  ulong local_3f8;
  FabType local_3ec;
  double *local_3e8;
  undefined8 uStack_3e0;
  undefined1 local_3d8 [16];
  ulong local_3c8;
  double local_3c0;
  double local_3b8;
  double local_3b0;
  ulong local_3a8;
  ulong local_3a0;
  FabArray<amrex::EBCellFlagFab> *local_398;
  double *local_390;
  ulong local_388;
  int local_37c;
  long local_378;
  long local_370;
  long local_368;
  long local_360;
  ulong local_358;
  ulong local_350;
  ulong local_348;
  ulong local_340;
  undefined1 local_334 [20];
  uint local_320;
  IndexType local_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  MLCellLinOp *local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  ulong local_290;
  long local_288;
  long local_280;
  double *local_278;
  ulong local_270;
  long *local_268;
  long *local_260;
  MFIter local_258;
  undefined1 local_1f8 [16];
  undefined8 local_1e8;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  MultiFab local_1b0;
  
  local_510 = (ulong)(uint)(this->super_MLLinOp).maxorder;
  local_498 = (*(this->super_MLLinOp)._vptr_MLLinOp[5])();
  if (0 < (this->super_MLLinOp).m_num_amr_levels) {
    uVar48 = (ulong)(uint)(this->super_MLLinOp).info.hidden_direction;
    local_3f8 = (ulong)((uint)local_510 - 1);
    local_1c8 = ZEXT416((uint)local_510);
    local_270 = (ulong)local_498;
    local_2b8 = 0;
    local_1d8 = ZEXT416(1);
    local_2c0 = this;
    local_290 = uVar48;
    do {
      if (0 < (this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [local_2b8]) {
        local_2a8 = local_2b8 * 0x18;
        local_2b0 = local_2b8 * 3;
        lVar23 = 0;
        do {
          local_378 = *(long *)(*(long *)((long)&(((this->m_bcondloc).
                                                                                                      
                                                  super_vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                                                  .
                                                  super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 super_vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                                                 ).
                                                 super__Vector_base<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start +
                                         local_2a8) + lVar23 * 8);
          local_280 = lVar23 * 0x900 +
                      *(long *)((long)&(((this->m_maskvals).
                                         super_vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                                         .
                                         super__Vector_base<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super_vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                                       ).
                                       super__Vector_base<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + local_2a8);
          lVar53 = *(long *)((long)&(((this->super_MLLinOp).m_geom.
                                      super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                      .
                                      super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>)
                                    .
                                    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                    ._M_impl.super__Vector_impl_data._M_start + local_2a8);
          lVar28 = lVar23 * 200;
          local_3b0 = *(double *)(lVar53 + 0x38 + lVar28);
          local_3b8 = *(double *)(lVar53 + 0x40 + lVar28);
          local_3c0 = *(double *)(lVar53 + 0x48 + lVar28);
          local_288 = *(long *)((long)&(((this->m_undrrelxr).
                                         super_vector<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
                                         .
                                         super__Vector_base<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super_vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>
                                       ).
                                       super__Vector_base<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>
                                       ._M_impl.super__Vector_impl_data._M_start + local_2a8);
          _local_4f8 = (undefined1  [16])0x0;
          local_508 = (undefined1  [16])0x0;
          auVar80._8_8_ = 0;
          auVar80._0_8_ = local_4e8._8_8_;
          local_4e8 = auVar80 << 0x40;
          local_258.m_fa._M_t.
          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t
          .super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
          super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
               (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
                )&PTR__FabFactory_008378d0;
          MultiFab::MultiFab(&local_1b0,
                             (BoxArray *)
                             (lVar23 * 0x68 +
                             *(long *)((long)&(((this->super_MLLinOp).m_grids.
                                                super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                                .
                                                super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                              ).
                                              super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                              ._M_impl.super__Vector_impl_data._M_start + local_2a8)
                             ),(DistributionMapping *)
                               (lVar23 * 0x10 +
                               *(long *)((long)&(((this->super_MLLinOp).m_dmap.
                                                  super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                                  .
                                                  super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                                ).
                                                super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                                ._M_impl.super__Vector_impl_data._M_start +
                                        local_2a8)),local_498,0,(MFInfo *)local_508,
                             (FabFactory<amrex::FArrayBox> *)&local_258);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_4f8);
          _Var2._M_t.
          super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
          .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
               *(tuple<amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 *)&(&(((this->super_MLLinOp).m_factory.
                        super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                      ).
                      super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)[local_2b0][lVar23]._M_t;
          local_370 = lVar23;
          if ((__uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               )_Var2._M_t.
                super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl ==
              (__uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               )0x0) {
            lVar23 = 0;
          }
          else {
            lVar23 = __dynamic_cast(_Var2._M_t.
                                    super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                                    .
                                    super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>
                                    ._M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                                    &EBFArrayBoxFactory::typeinfo,0);
          }
          if (lVar23 == 0) {
            local_398 = (FabArray<amrex::EBCellFlagFab> *)0x0;
            local_1f8 = (undefined1  [16])0x0;
            local_1e8 = 0;
          }
          else {
            local_398 = EBDataCollection::getMultiEBCellFlagFab
                                  (*(EBDataCollection **)(lVar23 + 0xd8));
            EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar23 + 0xd8));
          }
          local_508._0_4_ = local_508._1_4_ << 8;
          local_508._4_4_ = Gpu::Device::max_gpu_streams;
          auVar81._12_4_ = 0;
          auVar81._0_12_ = stack0xfffffffffffffb0c;
          _local_4f8 = auVar81 << 0x20;
          local_508._3_5_ = SUB85(local_508._0_8_,3);
          local_508._0_3_ = 0x10100;
          local_508._8_8_ = 0;
          MFIter::MFIter(&local_258,(FabArrayBase *)&local_1b0,(MFItInfo *)local_508);
          while (local_258.currentIndex < local_258.endIndex) {
            BATransformer::operator()
                      ((Box *)local_334,&((local_258.fabArray)->boxarray).m_bat,
                       (Box *)((long)((local_258.index_map)->super_vector<int,_std::allocator<int>_>
                                     ).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[local_258.currentIndex] * 0x1c
                              + *(long *)&((((local_258.fabArray)->boxarray).m_ref.
                                            super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->m_abox).
                                          super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                          ._M_impl.super__Vector_impl_data));
            piVar31 = &local_258.currentIndex;
            piVar47 = piVar31;
            if (local_258.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
              piVar47 = ((local_258.local_index_map)->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + local_258.currentIndex;
            }
            local_260 = (long *)((long)*piVar47 * 0x18 + *(long *)(local_378 + 0x200));
            piVar47 = piVar31;
            if (local_258.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
              piVar47 = ((local_258.local_index_map)->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + local_258.currentIndex;
            }
            local_268 = (long *)((long)*piVar47 * 0x18 + *(long *)(local_378 + 0xf0));
            if (local_398 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
              local_3ec = regular;
            }
            else {
              if (local_258.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
                piVar31 = ((local_258.local_index_map)->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + local_258.currentIndex;
              }
              local_3ec = EBCellFlagFab::getType
                                    ((local_398->m_fabs_v).
                                     super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[*piVar31],
                                     (Box *)local_334);
            }
            uVar41 = 0;
            do {
              if (uVar41 != uVar48) {
                local_508._8_4_ = local_334._8_4_;
                local_508._0_8_ = local_334._0_8_;
                local_5a8.jstride._0_4_ = local_320;
                local_5a8.p = (int *)local_334._12_8_;
                iVar13 = *(int *)(local_508 + uVar41 * 4);
                *(int *)(local_508 + uVar41 * 4) = iVar13 + -1;
                *(int *)((long)&local_5a8.p + uVar41 * 4) = iVar13 + -1;
                uVar5 = local_508._0_4_;
                lVar29 = (long)(int)local_508._0_4_;
                uVar7 = local_508._4_4_;
                lVar30 = (long)(int)local_508._4_4_;
                uVar9 = local_508._8_4_;
                piVar31 = (int *)(long)(int)local_508._8_4_;
                local_5e0 = (ulong)local_5a8.p & 0xffffffff;
                local_5f0 = (ulong)local_5a8.p >> 0x20;
                local_610 = (ulong)(uint)local_5a8.jstride;
                local_508._8_4_ = local_334._8_4_;
                local_508._0_8_ = local_334._0_8_;
                local_5a8.jstride._0_4_ = local_320;
                local_5a8.p = (int *)local_334._12_8_;
                local_550.p = (int *)(CONCAT44(local_31c.itype >> 1,local_31c.itype) & 0x100000001);
                local_550.jstride._0_4_ = local_31c.itype >> 2 & 1;
                iVar13 = (~*(uint *)((long)&local_550.p + uVar41 * 4) & 1) +
                         *(int *)((long)&local_5a8.p + uVar41 * 4);
                *(int *)(local_508 + uVar41 * 4) = iVar13;
                *(int *)((long)&local_5a8.p + uVar41 * 4) = iVar13;
                lVar53 = local_280;
                uVar6 = local_508._0_4_;
                lVar28 = (long)(int)local_508._0_4_;
                uVar8 = local_508._4_4_;
                lVar24 = (long)(int)local_508._4_4_;
                uVar10 = local_508._8_4_;
                lVar25 = (long)(int)local_508._8_4_;
                local_5e8 = (ulong)local_5a8.p & 0xffffffff;
                local_5f8 = (ulong)local_5a8.p >> 0x20;
                local_618 = (ulong)(uint)local_5a8.jstride;
                local_410 = CONCAT44(local_410._4_4_,*(undefined4 *)(local_334 + uVar41 * 4));
                iVar13 = *(int *)(local_334 + uVar41 * 4 + 0xc);
                lVar23 = uVar41 * 0x180;
                local_388 = uVar41;
                FabArray<amrex::Mask>::array<amrex::Mask,_0>
                          (&local_5a8,(FabArray<amrex::Mask> *)(local_280 + lVar23),&local_258);
                FabArray<amrex::Mask>::array<amrex::Mask,_0>
                          (&local_550,(FabArray<amrex::Mask> *)(lVar53 + lVar23 + 0x480),&local_258)
                ;
                lVar53 = local_288 + local_370 * 0x970 + 8;
                FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                          (&local_658,(FabArray<amrex::FArrayBox> *)(lVar23 + lVar53),&local_258);
                FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                          (&local_698,
                           (FabArray<amrex::FArrayBox> *)(uVar41 * 0x180 + 0x480 + lVar53),
                           &local_258);
                uVar41 = local_388;
                uVar48 = local_290;
                if (0 < (int)local_498) {
                  uVar27 = (iVar13 - (int)local_410) + 2;
                  uVar32 = (ulong)uVar27;
                  if ((int)local_510 < (int)uVar27) {
                    uVar32 = local_510 & 0xffffffff;
                  }
                  uVar77 = (iVar13 - (int)local_410) + 1 + local_1d8._0_4_;
                  uVar56 = -(uint)((int)local_1c8._0_4_ < (int)uVar77);
                  iVar13 = (int)uVar32;
                  iVar14 = (int)local_5f8 + 1;
                  iVar17 = (int)local_5e0;
                  local_48c = iVar17 + 1;
                  iVar15 = (int)local_5f0 + 1;
                  lVar23 = (long)(iVar13 + -2);
                  iVar18 = (int)local_5e8;
                  iVar16 = iVar18 + 1;
                  uVar39 = iVar18 - uVar6;
                  uVar42 = iVar17 - uVar5;
                  uVar27 = (int)local_5f8 - uVar8;
                  uVar46 = (int)local_5f0 - uVar7;
                  local_3c8 = (ulong)uVar42 + 2 & 0x1fffffffe;
                  auVar82._4_4_ = 0;
                  auVar82._0_4_ = uVar42;
                  auVar82._8_4_ = uVar42;
                  auVar82._12_4_ = 0;
                  local_3a8 = (ulong)uVar39 + 2 & 0x1fffffffe;
                  auVar63._4_4_ = 0;
                  auVar63._0_4_ = uVar39;
                  auVar63._8_4_ = uVar39;
                  auVar63._12_4_ = 0;
                  local_358 = (ulong)uVar46 + 2 & 0x1fffffffe;
                  auVar83._4_4_ = 0;
                  auVar83._0_4_ = uVar46;
                  auVar83._8_4_ = uVar46;
                  auVar83._12_4_ = 0;
                  local_340 = (ulong)uVar27 + 2 & 0x1fffffffe;
                  auVar84._4_4_ = 0;
                  auVar84._0_4_ = uVar27;
                  auVar84._8_4_ = uVar27;
                  auVar84._12_4_ = 0;
                  auVar85._4_4_ = 0;
                  auVar85._0_4_ = iVar17 - uVar5;
                  auVar85._8_4_ = iVar17 - uVar5;
                  auVar85._12_4_ = 0;
                  auVar86._4_4_ = 0;
                  auVar86._0_4_ = iVar18 - uVar6;
                  auVar86._8_4_ = iVar18 - uVar6;
                  auVar86._12_4_ = 0;
                  local_410 = (ulong)(uint)(local_48c - uVar5);
                  local_3a0 = (ulong)(uint)(iVar16 - uVar6);
                  local_400 = (long)(uVar5 + 1) << 3;
                  local_490 = iVar15 - uVar7;
                  local_408 = (long)(uVar6 + -1) << 3;
                  local_494 = iVar14 - uVar8;
                  local_350 = (ulong)(uint)(local_48c - uVar5);
                  local_348 = (ulong)(uint)(iVar16 - uVar6);
                  local_554 = -(uint)(0 < (int)(~uVar56 & uVar77 | local_1c8._0_4_ & uVar56));
                  iVar17 = uVar7 + 1;
                  local_5d4 = uVar8 + -1;
                  iVar18 = uVar9 + 1;
                  local_5d8 = uVar10 + -1;
                  local_298 = lVar29 + 1;
                  local_2a0 = lVar28 + -1;
                  iVar19 = (int)local_610 + 1;
                  iVar20 = (int)local_618 + 1;
                  local_5b0 = lVar29 * 8;
                  local_560 = lVar29 * 4;
                  local_5b8 = lVar28 * 8;
                  local_568 = lVar28 * 4;
                  local_360 = lVar30 + 1;
                  local_368 = lVar24 + 1;
                  local_37c = uVar5 + 1;
                  local_710 = 0;
                  uVar26 = 0;
                  local_2d8 = auVar82;
                  local_3d8 = auVar63;
                  local_2e8 = auVar83;
                  local_2f8 = auVar84;
                  local_308 = auVar85;
                  local_318 = auVar86;
                  auVar80 = _DAT_0077bb30;
                  auVar81 = _DAT_0077bb40;
                  do {
                    dVar75 = 1.0;
                    dVar58 = 1.0;
                    uVar59 = 0x3ff0000000000000;
                    local_4a0 = uVar26;
                    lVar33 = uVar26 * 0x18 + *local_268;
                    iVar49 = *(int *)(lVar33 + local_388 * 4);
                    lVar53 = uVar26 * 0x30 + *local_260;
                    iVar35 = *(int *)(lVar33 + 0xc + local_388 * 4);
                    uVar48 = *(ulong *)(lVar53 + local_388 * 8);
                    auVar61._8_8_ = 0;
                    auVar61._0_8_ = uVar48;
                    pdVar1 = *(double **)(lVar53 + 0x18 + local_388 * 8);
                    iVar79 = (int)local_388;
                    if (local_3ec == regular) {
                      uVar41 = (ulong)DAT_0077bb00;
                      iVar22 = (int)local_610;
                      iVar44 = (int)local_5e0;
                      iVar21 = (int)local_618;
                      iVar43 = (int)local_5e8;
                      if (iVar79 == 1) {
                        if (iVar49 == 0x65) {
                          local_508._8_8_ = 0x3fe0000000000000;
                          local_508._0_8_ = (double)(uVar48 ^ uVar41) * local_3b8;
                          uStack_4f0 = 0x4004000000000000;
                          local_4f8 = (undefined1  [8])0x3ff8000000000000;
                          local_488.kstride = 0;
                          local_488.nstride = 0;
                          local_488.p = (double *)0x0;
                          local_488.jstride = 0;
                          if (0 < iVar13) {
                            uVar48 = 0;
                            do {
                              uVar41 = 0;
                              dVar60 = dVar58;
                              dVar76 = dVar75;
                              do {
                                if (uVar48 != uVar41) {
                                  dVar60 = dVar60 * (-0.5 - *(double *)(local_508 + uVar41 * 8));
                                  dVar76 = dVar76 * (*(double *)(local_508 + uVar48 * 8) -
                                                    *(double *)(local_508 + uVar41 * 8));
                                }
                                uVar41 = uVar41 + 1;
                              } while (uVar32 != uVar41);
                              (&local_488.p)[uVar48] = (double *)(dVar60 / dVar76);
                              uVar48 = uVar48 + 1;
                            } while (uVar48 != uVar32);
                          }
                          if ((int)uVar9 <= iVar22) {
                            lVar53 = (long)local_658.p +
                                     local_658.nstride * local_710 +
                                     ((long)piVar31 - (long)local_658.begin.z) *
                                     local_658.kstride * 8 +
                                     (iVar17 - local_658.begin.y) * local_658.jstride * 8 +
                                     (long)local_658.begin.x * -8 + local_5b0;
                            lVar33 = (long)local_5a8.p +
                                     ((long)piVar31 - (long)local_5a8.begin.z) *
                                     local_5a8.kstride * 4 +
                                     (long)(uVar7 - local_5a8.begin.y) *
                                     CONCAT44(local_5a8.jstride._4_4_,(uint)local_5a8.jstride) * 4 +
                                     (long)local_5a8.begin.x * -4 + local_560;
                            piVar47 = piVar31;
                            do {
                              if ((int)uVar5 <= iVar44) {
                                lVar34 = 0;
                                do {
                                  LVar78 = local_488.jstride;
                                  if (*(int *)(lVar33 + lVar34 * 4) < 1) {
                                    LVar78 = 0;
                                  }
                                  *(Long *)(lVar53 + lVar34 * 8) = LVar78;
                                  lVar34 = lVar34 + 1;
                                } while ((int)local_410 != (int)lVar34);
                              }
                              piVar47 = (int *)((long)piVar47 + 1);
                              lVar53 = lVar53 + local_658.kstride * 8;
                              lVar33 = lVar33 + local_5a8.kstride * 4;
                            } while (iVar19 != (int)piVar47);
                          }
                        }
                        else if (iVar49 == 0x66) {
                          if ((int)uVar9 <= iVar22) {
                            lVar53 = (long)local_658.p +
                                     local_658.nstride * local_710 +
                                     ((long)piVar31 - (long)local_658.begin.z) *
                                     local_658.kstride * 8 +
                                     (iVar17 - local_658.begin.y) * local_658.jstride * 8 +
                                     (long)local_658.begin.x * -8 + local_5b0 + 8;
                            piVar47 = piVar31;
                            do {
                              if ((int)uVar5 <= iVar44) {
                                uVar48 = 0;
                                do {
                                  auVar67._8_4_ = (int)uVar48;
                                  auVar67._0_8_ = uVar48;
                                  auVar67._12_4_ = (int)(uVar48 >> 0x20);
                                  auVar61 = (auVar67 | auVar80) ^ auVar81;
                                  bVar4 = SUB164(auVar82 ^ auVar81,0) < auVar61._0_4_;
                                  iVar49 = SUB164(auVar82 ^ auVar81,4);
                                  iVar79 = auVar61._4_4_;
                                  if ((bool)(~(iVar49 < iVar79 || iVar79 == iVar49 && bVar4) & 1)) {
                                    *(undefined8 *)(lVar53 + -8 + uVar48 * 8) = 0x3ff0000000000000;
                                  }
                                  if (iVar49 >= iVar79 && (iVar79 != iVar49 || !bVar4)) {
                                    *(undefined8 *)(lVar53 + uVar48 * 8) = 0x3ff0000000000000;
                                  }
                                  uVar48 = uVar48 + 2;
                                } while (local_3c8 != uVar48);
                              }
                              piVar47 = (int *)((long)piVar47 + 1);
                              lVar53 = lVar53 + local_658.kstride * 8;
                            } while (iVar19 != (int)piVar47);
                          }
                        }
                        else if ((iVar49 == 0x67) && ((int)uVar9 <= iVar22)) {
                          lVar53 = (long)local_658.p +
                                   local_658.nstride * local_710 +
                                   ((long)piVar31 - (long)local_658.begin.z) * local_658.kstride * 8
                                   + (iVar17 - local_658.begin.y) * local_658.jstride * 8 +
                                   (long)local_658.begin.x * -8 + local_5b0;
                          lVar33 = (long)local_5a8.p +
                                   ((long)piVar31 - (long)local_5a8.begin.z) * local_5a8.kstride * 4
                                   + (long)(uVar7 - local_5a8.begin.y) *
                                     CONCAT44(local_5a8.jstride._4_4_,(uint)local_5a8.jstride) * 4 +
                                   (long)local_5a8.begin.x * -4 + local_560;
                          piVar47 = piVar31;
                          do {
                            if ((int)uVar5 <= iVar44) {
                              lVar34 = 0;
                              do {
                                uVar57 = uVar59;
                                if (*(int *)(lVar33 + lVar34 * 4) < 1) {
                                  uVar57 = 0;
                                }
                                *(undefined8 *)(lVar53 + lVar34 * 8) = uVar57;
                                lVar34 = lVar34 + 1;
                              } while ((int)local_410 != (int)lVar34);
                            }
                            piVar47 = (int *)((long)piVar47 + 1);
                            lVar53 = lVar53 + local_658.kstride * 8;
                            lVar33 = lVar33 + local_5a8.kstride * 4;
                          } while (iVar19 != (int)piVar47);
                        }
                        iVar49 = (int)local_3a0;
                        if (iVar35 == 0x65) {
                          local_508._8_8_ = 0x3fe0000000000000;
                          local_508._0_8_ = -(double)pdVar1 * local_3b8;
                          uStack_4f0 = 0x4004000000000000;
                          local_4f8 = (undefined1  [8])0x3ff8000000000000;
                          local_488.kstride = 0;
                          local_488.nstride = 0;
                          local_488.p = (double *)0x0;
                          local_488.jstride = 0;
                          if (0 < iVar13) {
                            uVar48 = 0;
                            do {
                              uVar41 = 0;
                              dVar60 = dVar58;
                              dVar76 = dVar75;
                              do {
                                if (uVar48 != uVar41) {
                                  dVar60 = dVar60 * (-0.5 - *(double *)(local_508 + uVar41 * 8));
                                  dVar76 = dVar76 * (*(double *)(local_508 + uVar48 * 8) -
                                                    *(double *)(local_508 + uVar41 * 8));
                                }
                                uVar41 = uVar41 + 1;
                              } while (uVar32 != uVar41);
                              (&local_488.p)[uVar48] = (double *)(dVar60 / dVar76);
                              uVar48 = uVar48 + 1;
                            } while (uVar48 != uVar32);
                          }
                          if ((int)uVar10 <= iVar21) {
                            lVar33 = (long)local_698.p +
                                     local_698.nstride * local_710 +
                                     (lVar25 - local_698.begin.z) * local_698.kstride * 8 +
                                     (local_5d4 - local_698.begin.y) * local_698.jstride * 8 +
                                     (long)local_698.begin.x * -8 + local_5b8;
                            lVar34 = (long)local_550.p +
                                     (lVar25 - local_550.begin.z) * local_550.kstride * 4 +
                                     (long)(uVar8 - local_550.begin.y) *
                                     CONCAT44(local_550.jstride._4_4_,(uint)local_550.jstride) * 4 +
                                     (long)local_550.begin.x * -4 + local_568;
                            lVar53 = lVar25;
                            do {
                              if ((int)uVar6 <= iVar43) {
                                lVar37 = 0;
                                do {
                                  LVar78 = local_488.jstride;
                                  if (*(int *)(lVar34 + lVar37 * 4) < 1) {
                                    LVar78 = 0;
                                  }
                                  *(Long *)(lVar33 + lVar37 * 8) = LVar78;
                                  lVar37 = lVar37 + 1;
                                } while (iVar49 != (int)lVar37);
                              }
                              lVar53 = lVar53 + 1;
                              lVar33 = lVar33 + local_698.kstride * 8;
                              lVar34 = lVar34 + local_550.kstride * 4;
                            } while (iVar20 != (int)lVar53);
                          }
                        }
                        else if (iVar35 == 0x66) {
                          if ((int)uVar10 <= iVar21) {
                            lVar33 = (long)local_698.p +
                                     local_698.nstride * local_710 +
                                     (lVar25 - local_698.begin.z) * local_698.kstride * 8 +
                                     (local_5d4 - local_698.begin.y) * local_698.jstride * 8 +
                                     (long)local_698.begin.x * -8 + local_5b8 + 8;
                            lVar53 = lVar25;
                            do {
                              if ((int)uVar6 <= iVar43) {
                                uVar48 = 0;
                                do {
                                  auVar70._8_4_ = (int)uVar48;
                                  auVar70._0_8_ = uVar48;
                                  auVar70._12_4_ = (int)(uVar48 >> 0x20);
                                  auVar61 = (auVar70 | auVar80) ^ auVar81;
                                  bVar4 = SUB164(auVar63 ^ auVar81,0) < auVar61._0_4_;
                                  iVar49 = SUB164(auVar63 ^ auVar81,4);
                                  iVar35 = auVar61._4_4_;
                                  if ((bool)(~(iVar49 < iVar35 || iVar35 == iVar49 && bVar4) & 1)) {
                                    *(undefined8 *)(lVar33 + -8 + uVar48 * 8) = 0x3ff0000000000000;
                                  }
                                  if (iVar49 >= iVar35 && (iVar35 != iVar49 || !bVar4)) {
                                    *(undefined8 *)(lVar33 + uVar48 * 8) = 0x3ff0000000000000;
                                  }
                                  uVar48 = uVar48 + 2;
                                } while (local_3a8 != uVar48);
                              }
                              lVar53 = lVar53 + 1;
                              lVar33 = lVar33 + local_698.kstride * 8;
                            } while (iVar20 != (int)lVar53);
                          }
                        }
                        else if ((iVar35 == 0x67) && ((int)uVar10 <= iVar21)) {
                          lVar33 = (long)local_698.p +
                                   local_698.nstride * local_710 +
                                   (lVar25 - local_698.begin.z) * local_698.kstride * 8 +
                                   (local_5d4 - local_698.begin.y) * local_698.jstride * 8 +
                                   (long)local_698.begin.x * -8 + local_5b8;
                          lVar34 = (long)local_550.p +
                                   (lVar25 - local_550.begin.z) * local_550.kstride * 4 +
                                   (long)(uVar8 - local_550.begin.y) *
                                   CONCAT44(local_550.jstride._4_4_,(uint)local_550.jstride) * 4 +
                                   (long)local_550.begin.x * -4 + local_568;
                          lVar53 = lVar25;
                          do {
                            if ((int)uVar6 <= iVar43) {
                              lVar37 = 0;
                              do {
                                uVar59 = 0x3ff0000000000000;
                                if (*(int *)(lVar34 + lVar37 * 4) < 1) {
                                  uVar59 = 0;
                                }
                                *(undefined8 *)(lVar33 + lVar37 * 8) = uVar59;
                                lVar37 = lVar37 + 1;
                              } while (iVar49 != (int)lVar37);
                            }
                            lVar53 = lVar53 + 1;
                            lVar33 = lVar33 + local_698.kstride * 8;
                            lVar34 = lVar34 + local_550.kstride * 4;
                          } while (iVar20 != (int)lVar53);
                        }
                      }
                      else {
                        iVar52 = (int)local_5f0;
                        iVar51 = (int)local_5f8;
                        if (iVar79 == 0) {
                          local_608 = CONCAT44(local_608._4_4_,iVar35);
                          if (iVar49 == 0x65) {
                            local_508._8_8_ = 0x3fe0000000000000;
                            local_508._0_8_ = (double)(uVar48 ^ uVar41) * local_3b0;
                            uStack_4f0 = 0x4004000000000000;
                            local_4f8 = (undefined1  [8])0x3ff8000000000000;
                            local_488.kstride = 0;
                            local_488.nstride = 0;
                            local_488.p = (double *)0x0;
                            local_488.jstride = 0;
                            if ((local_554 & 1) != 0) {
                              uVar48 = 0;
                              do {
                                uVar41 = 0;
                                dVar60 = dVar58;
                                dVar76 = dVar75;
                                do {
                                  if (uVar48 != uVar41) {
                                    dVar60 = dVar60 * (-0.5 - *(double *)(local_508 + uVar41 * 8));
                                    dVar76 = dVar76 * (*(double *)(local_508 + uVar48 * 8) -
                                                      *(double *)(local_508 + uVar41 * 8));
                                  }
                                  uVar41 = uVar41 + 1;
                                } while (uVar32 != uVar41);
                                (&local_488.p)[uVar48] = (double *)(dVar60 / dVar76);
                                uVar48 = uVar48 + 1;
                              } while (uVar48 != uVar32);
                            }
                            if ((int)uVar9 <= iVar22) {
                              plVar38 = (long *)((long)local_658.p +
                                                local_658.nstride * local_710 +
                                                ((long)piVar31 - (long)local_658.begin.z) *
                                                local_658.kstride * 8 +
                                                (lVar30 - local_658.begin.y) * local_658.jstride * 8
                                                + (long)local_658.begin.x * -8 + local_400);
                              piVar40 = (int *)((long)local_5a8.p +
                                               ((long)piVar31 - (long)local_5a8.begin.z) *
                                               local_5a8.kstride * 4 +
                                               (lVar30 - local_5a8.begin.y) *
                                               CONCAT44(local_5a8.jstride._4_4_,
                                                        (uint)local_5a8.jstride) * 4 +
                                               (long)local_5a8.begin.x * -4 + local_560);
                              piVar47 = piVar31;
                              do {
                                piVar50 = piVar40;
                                plVar55 = plVar38;
                                iVar49 = local_490;
                                if ((int)uVar7 <= iVar52) {
                                  do {
                                    LVar78 = local_488.jstride;
                                    if (*piVar50 < 1) {
                                      LVar78 = 0;
                                    }
                                    *plVar55 = LVar78;
                                    plVar55 = plVar55 + local_658.jstride;
                                    piVar50 = piVar50 + CONCAT44(local_5a8.jstride._4_4_,
                                                                 (uint)local_5a8.jstride);
                                    iVar49 = iVar49 + -1;
                                  } while (iVar49 != 0);
                                }
                                piVar47 = (int *)((long)piVar47 + 1);
                                plVar38 = plVar38 + local_658.kstride;
                                piVar40 = piVar40 + local_5a8.kstride;
                              } while (iVar19 != (int)piVar47);
                            }
                          }
                          else if (iVar49 == 0x66) {
                            if ((int)uVar9 <= iVar22) {
                              lVar53 = local_658.kstride * 8;
                              lVar34 = ((long)piVar31 - (long)local_658.begin.z) * lVar53;
                              lVar33 = (long)local_658.p +
                                       (lVar30 - local_658.begin.y) * local_658.jstride * 8 + lVar34
                                       + local_658.nstride * local_710 +
                                       (long)local_658.begin.x * -8 + local_400;
                              lVar34 = (long)local_658.p +
                                       (local_360 - local_658.begin.y) * local_658.jstride * 8 +
                                       lVar34 + local_658.nstride * local_710 +
                                       (long)local_658.begin.x * -8 + local_400;
                              piVar47 = piVar31;
                              do {
                                if ((int)uVar7 <= iVar52) {
                                  lVar37 = 0;
                                  uVar48 = 0;
                                  do {
                                    auVar64._8_4_ = (int)uVar48;
                                    auVar64._0_8_ = uVar48;
                                    auVar64._12_4_ = (int)(uVar48 >> 0x20);
                                    auVar61 = (auVar64 | auVar80) ^ auVar81;
                                    bVar4 = SUB164(auVar83 ^ auVar81,0) < auVar61._0_4_;
                                    iVar49 = SUB164(auVar83 ^ auVar81,4);
                                    iVar79 = auVar61._4_4_;
                                    if ((bool)(~(iVar49 < iVar79 || iVar79 == iVar49 && bVar4) & 1))
                                    {
                                      *(undefined8 *)(lVar33 + lVar37) = 0x3ff0000000000000;
                                    }
                                    if (iVar49 >= iVar79 && (iVar79 != iVar49 || !bVar4)) {
                                      *(undefined8 *)(lVar34 + lVar37) = 0x3ff0000000000000;
                                    }
                                    uVar48 = uVar48 + 2;
                                    lVar37 = lVar37 + local_658.jstride * 0x10;
                                  } while (local_358 != uVar48);
                                }
                                piVar47 = (int *)((long)piVar47 + 1);
                                lVar33 = lVar33 + lVar53;
                                lVar34 = lVar34 + lVar53;
                              } while (iVar19 != (int)piVar47);
                            }
                          }
                          else if ((iVar49 == 0x67) && ((int)uVar9 <= iVar22)) {
                            puVar36 = (undefined8 *)
                                      ((long)local_658.p +
                                      local_658.nstride * local_710 +
                                      ((long)piVar31 - (long)local_658.begin.z) *
                                      local_658.kstride * 8 +
                                      (lVar30 - local_658.begin.y) * local_658.jstride * 8 +
                                      (long)local_658.begin.x * -8 + local_400);
                            piVar40 = (int *)((long)local_5a8.p +
                                             ((long)piVar31 - (long)local_5a8.begin.z) *
                                             local_5a8.kstride * 4 +
                                             (lVar30 - local_5a8.begin.y) *
                                             CONCAT44(local_5a8.jstride._4_4_,
                                                      (uint)local_5a8.jstride) * 4 +
                                             (long)local_5a8.begin.x * -4 + local_560);
                            piVar47 = piVar31;
                            do {
                              piVar50 = piVar40;
                              puVar54 = puVar36;
                              iVar49 = local_490;
                              if ((int)uVar7 <= iVar52) {
                                do {
                                  uVar57 = uVar59;
                                  if (*piVar50 < 1) {
                                    uVar57 = 0;
                                  }
                                  *puVar54 = uVar57;
                                  puVar54 = puVar54 + local_658.jstride;
                                  piVar50 = piVar50 + CONCAT44(local_5a8.jstride._4_4_,
                                                               (uint)local_5a8.jstride);
                                  iVar49 = iVar49 + -1;
                                } while (iVar49 != 0);
                              }
                              piVar47 = (int *)((long)piVar47 + 1);
                              puVar36 = puVar36 + local_658.kstride;
                              piVar40 = piVar40 + local_5a8.kstride;
                            } while (iVar19 != (int)piVar47);
                          }
                          if (iVar35 == 0x65) {
                            local_508._8_8_ = 0x3fe0000000000000;
                            local_508._0_8_ = -(double)pdVar1 * local_3b0;
                            uStack_4f0 = 0x4004000000000000;
                            local_4f8 = (undefined1  [8])0x3ff8000000000000;
                            local_488.kstride = 0;
                            local_488.nstride = 0;
                            local_488.p = (double *)0x0;
                            local_488.jstride = 0;
                            if ((local_554 & 1) != 0) {
                              uVar48 = 0;
                              do {
                                uVar41 = 0;
                                dVar60 = dVar58;
                                dVar76 = dVar75;
                                do {
                                  if (uVar48 != uVar41) {
                                    dVar60 = dVar60 * (-0.5 - *(double *)(local_508 + uVar41 * 8));
                                    dVar76 = dVar76 * (*(double *)(local_508 + uVar48 * 8) -
                                                      *(double *)(local_508 + uVar41 * 8));
                                  }
                                  uVar41 = uVar41 + 1;
                                } while (uVar32 != uVar41);
                                (&local_488.p)[uVar48] = (double *)(dVar60 / dVar76);
                                uVar48 = uVar48 + 1;
                              } while (uVar48 != uVar32);
                            }
                            if ((int)uVar10 <= iVar21) {
                              plVar38 = (long *)((long)local_698.p +
                                                local_698.nstride * local_710 +
                                                (lVar25 - local_698.begin.z) * local_698.kstride * 8
                                                + (lVar24 - local_698.begin.y) *
                                                  local_698.jstride * 8 +
                                                (long)local_698.begin.x * -8 + local_408);
                              piVar47 = (int *)((long)local_550.p +
                                               (lVar25 - local_550.begin.z) * local_550.kstride * 4
                                               + (lVar24 - local_550.begin.y) *
                                                 CONCAT44(local_550.jstride._4_4_,
                                                          (uint)local_550.jstride) * 4 +
                                               (long)local_550.begin.x * -4 + local_568);
                              lVar53 = lVar25;
                              do {
                                piVar40 = piVar47;
                                plVar55 = plVar38;
                                iVar49 = local_494;
                                if ((int)uVar8 <= iVar51) {
                                  do {
                                    LVar78 = local_488.jstride;
                                    if (*piVar40 < 1) {
                                      LVar78 = 0;
                                    }
                                    *plVar55 = LVar78;
                                    plVar55 = plVar55 + local_698.jstride;
                                    piVar40 = piVar40 + CONCAT44(local_550.jstride._4_4_,
                                                                 (uint)local_550.jstride);
                                    iVar49 = iVar49 + -1;
                                  } while (iVar49 != 0);
                                }
                                lVar53 = lVar53 + 1;
                                plVar38 = plVar38 + local_698.kstride;
                                piVar47 = piVar47 + local_550.kstride;
                              } while (iVar20 != (int)lVar53);
                            }
                          }
                          else if (iVar35 == 0x66) {
                            if ((int)uVar10 <= iVar21) {
                              lVar33 = local_698.kstride * 8;
                              lVar53 = (lVar25 - local_698.begin.z) * lVar33;
                              lVar34 = (long)local_698.p +
                                       (lVar24 - local_698.begin.y) * local_698.jstride * 8 + lVar53
                                       + local_698.nstride * local_710 +
                                       (long)local_698.begin.x * -8 + local_408;
                              lVar37 = (long)local_698.p +
                                       (local_368 - local_698.begin.y) * local_698.jstride * 8 +
                                       lVar53 + local_698.nstride * local_710 +
                                       (long)local_698.begin.x * -8 + local_408;
                              lVar53 = lVar25;
                              do {
                                if ((int)uVar8 <= iVar51) {
                                  lVar45 = 0;
                                  uVar48 = 0;
                                  do {
                                    auVar68._8_4_ = (int)uVar48;
                                    auVar68._0_8_ = uVar48;
                                    auVar68._12_4_ = (int)(uVar48 >> 0x20);
                                    auVar61 = (auVar68 | auVar80) ^ auVar81;
                                    bVar4 = SUB164(auVar84 ^ auVar81,0) < auVar61._0_4_;
                                    iVar49 = SUB164(auVar84 ^ auVar81,4);
                                    iVar35 = auVar61._4_4_;
                                    if ((bool)(~(iVar49 < iVar35 || iVar35 == iVar49 && bVar4) & 1))
                                    {
                                      *(undefined8 *)(lVar34 + lVar45) = 0x3ff0000000000000;
                                    }
                                    if (iVar49 >= iVar35 && (iVar35 != iVar49 || !bVar4)) {
                                      *(undefined8 *)(lVar37 + lVar45) = 0x3ff0000000000000;
                                    }
                                    uVar48 = uVar48 + 2;
                                    lVar45 = lVar45 + local_698.jstride * 0x10;
                                  } while (local_340 != uVar48);
                                }
                                lVar53 = lVar53 + 1;
                                lVar34 = lVar34 + lVar33;
                                lVar37 = lVar37 + lVar33;
                              } while (iVar20 != (int)lVar53);
                            }
                          }
                          else if ((iVar35 == 0x67) && ((int)uVar10 <= iVar21)) {
                            puVar36 = (undefined8 *)
                                      ((long)local_698.p +
                                      local_698.nstride * local_710 +
                                      (lVar25 - local_698.begin.z) * local_698.kstride * 8 +
                                      (lVar24 - local_698.begin.y) * local_698.jstride * 8 +
                                      (long)local_698.begin.x * -8 + local_408);
                            piVar47 = (int *)((long)local_550.p +
                                             (lVar25 - local_550.begin.z) * local_550.kstride * 4 +
                                             (lVar24 - local_550.begin.y) *
                                             CONCAT44(local_550.jstride._4_4_,
                                                      (uint)local_550.jstride) * 4 +
                                             (long)local_550.begin.x * -4 + local_568);
                            lVar53 = lVar25;
                            do {
                              piVar40 = piVar47;
                              puVar54 = puVar36;
                              iVar49 = local_494;
                              if ((int)uVar8 <= iVar51) {
                                do {
                                  uVar59 = 0x3ff0000000000000;
                                  if (*piVar40 < 1) {
                                    uVar59 = 0;
                                  }
                                  *puVar54 = uVar59;
                                  puVar54 = puVar54 + local_698.jstride;
                                  piVar40 = piVar40 + CONCAT44(local_550.jstride._4_4_,
                                                               (uint)local_550.jstride);
                                  iVar49 = iVar49 + -1;
                                } while (iVar49 != 0);
                              }
                              lVar53 = lVar53 + 1;
                              puVar36 = puVar36 + local_698.kstride;
                              piVar47 = piVar47 + local_550.kstride;
                            } while (iVar20 != (int)lVar53);
                          }
                        }
                        else {
                          iVar79 = (int)local_350;
                          if (iVar49 == 0x65) {
                            local_508._8_8_ = 0x3fe0000000000000;
                            local_508._0_8_ = (double)(uVar48 ^ uVar41) * local_3c0;
                            uStack_4f0 = 0x4004000000000000;
                            local_4f8 = (undefined1  [8])0x3ff8000000000000;
                            local_488.kstride = 0;
                            local_488.nstride = 0;
                            local_488.p = (double *)0x0;
                            local_488.jstride = 0;
                            if ((local_554 & 1) != 0) {
                              uVar48 = 0;
                              do {
                                uVar41 = 0;
                                dVar60 = dVar58;
                                dVar76 = dVar75;
                                do {
                                  if (uVar48 != uVar41) {
                                    dVar60 = dVar60 * (-0.5 - *(double *)(local_508 + uVar41 * 8));
                                    dVar76 = dVar76 * (*(double *)(local_508 + uVar48 * 8) -
                                                      *(double *)(local_508 + uVar41 * 8));
                                  }
                                  uVar41 = uVar41 + 1;
                                } while (uVar32 != uVar41);
                                (&local_488.p)[uVar48] = (double *)(dVar60 / dVar76);
                                uVar48 = uVar48 + 1;
                              } while (uVar48 != uVar32);
                            }
                            if ((int)uVar7 <= iVar52) {
                              lVar33 = (long)local_658.p +
                                       local_658.nstride * local_710 +
                                       (lVar30 - local_658.begin.y) * local_658.jstride * 8 +
                                       (iVar18 - local_658.begin.z) * local_658.kstride * 8 +
                                       (long)local_658.begin.x * -8 + local_5b0;
                              lVar34 = CONCAT44(local_5a8.jstride._4_4_,(uint)local_5a8.jstride) * 4
                              ;
                              lVar37 = (long)local_5a8.p +
                                       (lVar30 - local_5a8.begin.y) * lVar34 +
                                       (uVar9 - local_5a8.begin.z) * local_5a8.kstride * 4 +
                                       (long)local_5a8.begin.x * -4 + local_560;
                              lVar53 = lVar30;
                              do {
                                if ((int)uVar5 <= iVar44) {
                                  lVar45 = 0;
                                  do {
                                    LVar78 = local_488.jstride;
                                    if (*(int *)(lVar37 + lVar45 * 4) < 1) {
                                      LVar78 = 0;
                                    }
                                    *(Long *)(lVar33 + lVar45 * 8) = LVar78;
                                    lVar45 = lVar45 + 1;
                                  } while (iVar79 != (int)lVar45);
                                }
                                lVar53 = lVar53 + 1;
                                lVar33 = lVar33 + local_658.jstride * 8;
                                lVar37 = lVar37 + lVar34;
                              } while (iVar15 != (int)lVar53);
                            }
                          }
                          else if (iVar49 == 0x66) {
                            if ((int)uVar7 <= iVar52) {
                              lVar33 = (long)local_658.p +
                                       local_658.nstride * local_710 +
                                       (lVar30 - local_658.begin.y) * local_658.jstride * 8 +
                                       (iVar18 - local_658.begin.z) * local_658.kstride * 8 +
                                       (long)local_658.begin.x * -8 + local_5b0 + 8;
                              lVar53 = lVar30;
                              do {
                                if ((int)uVar5 <= iVar44) {
                                  uVar48 = 0;
                                  do {
                                    auVar72._8_4_ = (int)uVar48;
                                    auVar72._0_8_ = uVar48;
                                    auVar72._12_4_ = (int)(uVar48 >> 0x20);
                                    auVar61 = (auVar72 | auVar80) ^ auVar81;
                                    bVar4 = SUB164(auVar85 ^ auVar81,0) < auVar61._0_4_;
                                    iVar49 = SUB164(auVar85 ^ auVar81,4);
                                    iVar79 = auVar61._4_4_;
                                    if ((bool)(~(iVar49 < iVar79 || iVar79 == iVar49 && bVar4) & 1))
                                    {
                                      *(undefined8 *)(lVar33 + -8 + uVar48 * 8) = 0x3ff0000000000000
                                      ;
                                    }
                                    if (iVar49 >= iVar79 && (iVar79 != iVar49 || !bVar4)) {
                                      *(undefined8 *)(lVar33 + uVar48 * 8) = 0x3ff0000000000000;
                                    }
                                    uVar48 = uVar48 + 2;
                                  } while (local_3c8 != uVar48);
                                }
                                lVar53 = lVar53 + 1;
                                lVar33 = lVar33 + local_658.jstride * 8;
                              } while (iVar15 != (int)lVar53);
                            }
                          }
                          else if ((iVar49 == 0x67) && ((int)uVar7 <= iVar52)) {
                            lVar33 = (long)local_658.p +
                                     local_658.nstride * local_710 +
                                     (lVar30 - local_658.begin.y) * local_658.jstride * 8 +
                                     (iVar18 - local_658.begin.z) * local_658.kstride * 8 +
                                     (long)local_658.begin.x * -8 + local_5b0;
                            lVar34 = CONCAT44(local_5a8.jstride._4_4_,(uint)local_5a8.jstride) * 4;
                            lVar37 = (long)local_5a8.p +
                                     (lVar30 - local_5a8.begin.y) * lVar34 +
                                     (uVar9 - local_5a8.begin.z) * local_5a8.kstride * 4 +
                                     (long)local_5a8.begin.x * -4 + local_560;
                            lVar53 = lVar30;
                            do {
                              if ((int)uVar5 <= iVar44) {
                                lVar45 = 0;
                                do {
                                  uVar57 = uVar59;
                                  if (*(int *)(lVar37 + lVar45 * 4) < 1) {
                                    uVar57 = 0;
                                  }
                                  *(undefined8 *)(lVar33 + lVar45 * 8) = uVar57;
                                  lVar45 = lVar45 + 1;
                                } while (iVar79 != (int)lVar45);
                              }
                              lVar53 = lVar53 + 1;
                              lVar33 = lVar33 + local_658.jstride * 8;
                              lVar37 = lVar37 + lVar34;
                            } while (iVar15 != (int)lVar53);
                          }
                          iVar49 = (int)local_348;
                          if (iVar35 == 0x65) {
                            local_508._8_8_ = 0x3fe0000000000000;
                            local_508._0_8_ = -(double)pdVar1 * local_3c0;
                            uStack_4f0 = 0x4004000000000000;
                            local_4f8 = (undefined1  [8])0x3ff8000000000000;
                            local_488.kstride = 0;
                            local_488.nstride = 0;
                            local_488.p = (double *)0x0;
                            local_488.jstride = 0;
                            if ((local_554 & 1) != 0) {
                              uVar48 = 0;
                              do {
                                uVar41 = 0;
                                dVar60 = dVar58;
                                dVar76 = dVar75;
                                do {
                                  if (uVar48 != uVar41) {
                                    dVar60 = dVar60 * (-0.5 - *(double *)(local_508 + uVar41 * 8));
                                    dVar76 = dVar76 * (*(double *)(local_508 + uVar48 * 8) -
                                                      *(double *)(local_508 + uVar41 * 8));
                                  }
                                  uVar41 = uVar41 + 1;
                                } while (uVar32 != uVar41);
                                (&local_488.p)[uVar48] = (double *)(dVar60 / dVar76);
                                uVar48 = uVar48 + 1;
                              } while (uVar48 != uVar32);
                            }
                            if ((int)uVar8 <= iVar51) {
                              lVar33 = (long)local_698.p +
                                       local_698.nstride * local_710 +
                                       (lVar24 - local_698.begin.y) * local_698.jstride * 8 +
                                       (local_5d8 - local_698.begin.z) * local_698.kstride * 8 +
                                       (long)local_698.begin.x * -8 + local_5b8;
                              lVar34 = CONCAT44(local_550.jstride._4_4_,(uint)local_550.jstride) * 4
                              ;
                              lVar37 = (long)local_550.p +
                                       (lVar24 - local_550.begin.y) * lVar34 +
                                       (uVar10 - local_550.begin.z) * local_550.kstride * 4 +
                                       (long)local_550.begin.x * -4 + local_568;
                              lVar53 = lVar24;
                              do {
                                if ((int)uVar6 <= iVar43) {
                                  lVar45 = 0;
                                  do {
                                    LVar78 = local_488.jstride;
                                    if (*(int *)(lVar37 + lVar45 * 4) < 1) {
                                      LVar78 = 0;
                                    }
                                    *(Long *)(lVar33 + lVar45 * 8) = LVar78;
                                    lVar45 = lVar45 + 1;
                                  } while (iVar49 != (int)lVar45);
                                }
                                lVar53 = lVar53 + 1;
                                lVar33 = lVar33 + local_698.jstride * 8;
                                lVar37 = lVar37 + lVar34;
                              } while (iVar14 != (int)lVar53);
                            }
                          }
                          else if (iVar35 == 0x66) {
                            if ((int)uVar8 <= iVar51) {
                              lVar33 = (long)local_698.p +
                                       local_698.nstride * local_710 +
                                       (lVar24 - local_698.begin.y) * local_698.jstride * 8 +
                                       (local_5d8 - local_698.begin.z) * local_698.kstride * 8 +
                                       (long)local_698.begin.x * -8 + local_5b8 + 8;
                              lVar53 = lVar24;
                              do {
                                if ((int)uVar6 <= iVar43) {
                                  uVar48 = 0;
                                  do {
                                    auVar74._8_4_ = (int)uVar48;
                                    auVar74._0_8_ = uVar48;
                                    auVar74._12_4_ = (int)(uVar48 >> 0x20);
                                    auVar61 = (auVar74 | auVar80) ^ auVar81;
                                    bVar4 = SUB164(auVar86 ^ auVar81,0) < auVar61._0_4_;
                                    iVar49 = SUB164(auVar86 ^ auVar81,4);
                                    iVar35 = auVar61._4_4_;
                                    if ((bool)(~(iVar49 < iVar35 || iVar35 == iVar49 && bVar4) & 1))
                                    {
                                      *(undefined8 *)(lVar33 + -8 + uVar48 * 8) = 0x3ff0000000000000
                                      ;
                                    }
                                    if (iVar49 >= iVar35 && (iVar35 != iVar49 || !bVar4)) {
                                      *(undefined8 *)(lVar33 + uVar48 * 8) = 0x3ff0000000000000;
                                    }
                                    uVar48 = uVar48 + 2;
                                  } while (local_3a8 != uVar48);
                                }
                                lVar53 = lVar53 + 1;
                                lVar33 = lVar33 + local_698.jstride * 8;
                              } while (iVar14 != (int)lVar53);
                            }
                          }
                          else if ((iVar35 == 0x67) && ((int)uVar8 <= iVar51)) {
                            lVar33 = (long)local_698.p +
                                     local_698.nstride * local_710 +
                                     (lVar24 - local_698.begin.y) * local_698.jstride * 8 +
                                     (local_5d8 - local_698.begin.z) * local_698.kstride * 8 +
                                     (long)local_698.begin.x * -8 + local_5b8;
                            lVar34 = CONCAT44(local_550.jstride._4_4_,(uint)local_550.jstride) * 4;
                            lVar37 = (long)local_550.p +
                                     (lVar24 - local_550.begin.y) * lVar34 +
                                     (uVar10 - local_550.begin.z) * local_550.kstride * 4 +
                                     (long)local_550.begin.x * -4 + local_568;
                            lVar53 = lVar24;
                            do {
                              if ((int)uVar6 <= iVar43) {
                                lVar45 = 0;
                                do {
                                  uVar59 = 0x3ff0000000000000;
                                  if (*(int *)(lVar37 + lVar45 * 4) < 1) {
                                    uVar59 = 0;
                                  }
                                  *(undefined8 *)(lVar33 + lVar45 * 8) = uVar59;
                                  lVar45 = lVar45 + 1;
                                } while (iVar49 != (int)lVar45);
                              }
                              lVar53 = lVar53 + 1;
                              lVar33 = lVar33 + local_698.jstride * 8;
                              lVar37 = lVar37 + lVar34;
                            } while (iVar14 != (int)lVar53);
                          }
                        }
                      }
                    }
                    else if (local_3ec == singlevalued) {
                      local_448 = auVar61;
                      local_608 = CONCAT44(local_608._4_4_,iVar35);
                      local_3e8 = pdVar1;
                      uStack_3e0 = 0;
                      MultiCutFab::const_array
                                (&local_488,*(MultiCutFab **)(local_1f8 + local_388 * 8),&local_258)
                      ;
                      auVar82 = local_2d8;
                      auVar83 = local_2e8;
                      auVar84 = local_2f8;
                      auVar85 = local_308;
                      auVar86 = local_318;
                      pdVar1 = local_3e8;
                      uVar48 = local_3f8;
                      auVar81 = _DAT_0077bb40;
                      auVar80 = _DAT_0077bb30;
                      bVar4 = true;
                      iVar35 = (int)local_610;
                      iVar43 = (int)local_5e0;
                      iVar21 = (int)local_618;
                      dVar58 = local_448._0_8_;
                      iVar22 = (int)local_5e8;
                      if (iVar79 == 1) {
                        if (iVar49 == 0x65) {
                          local_430[0] = (double)((ulong)dVar58 ^ (ulong)DAT_0077bb00) * local_3b8;
                          local_430[1] = 0.5;
                          local_430[2] = 1.5;
                          local_430[3] = 2.5;
                          local_4b8 = ZEXT816(0);
                          local_4c8 = ZEXT816(0);
                          local_4d8 = ZEXT816(0);
                          local_4e8 = ZEXT816(0);
                          _local_4f8 = ZEXT816(0);
                          local_508 = ZEXT816(0);
                          if (1 < (int)local_510) {
                            lVar53 = 2;
                            uVar41 = 0;
                            do {
                              lVar33 = 0;
                              do {
                                lVar34 = 0;
                                dVar58 = 1.0;
                                dVar75 = 1.0;
                                do {
                                  if (lVar33 != lVar34) {
                                    dVar58 = dVar58 * (-0.5 - local_430[lVar34]);
                                    dVar75 = dVar75 * (local_430[lVar33] - local_430[lVar34]);
                                  }
                                  lVar34 = lVar34 + 1;
                                } while (lVar53 != lVar34);
                                *(double *)(local_508 + lVar33 * 8 + uVar41 * 0x20) =
                                     dVar58 / dVar75;
                                lVar33 = lVar33 + 1;
                              } while (lVar33 != lVar53);
                              uVar41 = uVar41 + 1;
                              lVar53 = lVar53 + 1;
                            } while (uVar41 != uVar48);
                          }
                          if ((int)uVar9 <= iVar35) {
                            local_600 = (int *)(long)local_5a8.begin.z;
                            local_5c0 = (double *)local_5a8.kstride;
                            local_5c8 = (double *)(long)local_658.begin.z;
                            local_5d0 = (double *)local_658.kstride;
                            local_4a8 = local_658.p +
                                        ((long)iVar17 - (long)local_658.begin.y) * local_658.jstride
                                        + local_658.nstride * local_4a0;
                            local_6b0 = piVar31;
                            do {
                              if ((int)uVar5 <= iVar43) {
                                local_448._0_8_ = (long)local_488.begin.x;
                                lVar53 = lVar29;
                                do {
                                  if (local_5a8.p
                                      [(lVar30 - local_5a8.begin.y) *
                                       CONCAT44(local_5a8.jstride._4_4_,(uint)local_5a8.jstride) +
                                       ((long)local_6b0 - (long)local_600) * local_5a8.kstride +
                                       (lVar53 - local_5a8.begin.x)] < 1) {
                                    iVar49 = 1;
                                  }
                                  else {
                                    if (iVar13 < 2) {
                                      iVar49 = 1;
                                      bVar12 = false;
                                    }
                                    else {
                                      iVar49 = 1;
                                      lVar33 = 0;
                                      bVar12 = false;
                                      do {
                                        dVar58 = local_488.p
                                                 [((long)local_6b0 - (long)local_488.begin.z) *
                                                  local_488.kstride +
                                                  (lVar53 - local_488.begin.x) +
                                                  ((int)lVar33 + (iVar17 - local_488.begin.y)) *
                                                  local_488.jstride];
                                        iVar49 = (uint)(0.0 < dVar58) + iVar49;
                                        bVar11 = bVar12;
                                        if (dVar58 < 1.0) {
                                          bVar11 = true;
                                        }
                                      } while ((0.0 < dVar58) &&
                                              (bVar3 = lVar33 < lVar23, lVar33 = lVar33 + 1,
                                              bVar12 = bVar11, bVar3));
                                    }
                                    if ((bVar12) && (1 < iVar49)) {
                                      iVar49 = 2;
                                    }
                                  }
                                  dVar58 = 0.0;
                                  if (iVar49 != 1) {
                                    dVar58 = *(double *)(local_508 + (long)(iVar49 * 4 + -7) * 8);
                                  }
                                  (local_658.p +
                                  ((long)iVar17 - (long)local_658.begin.y) * local_658.jstride +
                                  local_658.nstride * local_4a0)
                                  [((long)local_6b0 - (long)local_5c8) * local_658.kstride +
                                   (lVar53 - local_658.begin.x)] = dVar58;
                                  lVar53 = lVar53 + 1;
                                } while (local_48c != (int)lVar53);
                              }
                              local_6b0 = (int *)((long)local_6b0 + 1);
                            } while (iVar19 != (int)local_6b0);
                          }
                        }
                        else if (iVar49 == 0x66) {
                          if ((int)uVar9 <= iVar35) {
                            lVar53 = (long)local_658.p +
                                     local_658.nstride * local_710 +
                                     ((long)piVar31 - (long)local_658.begin.z) *
                                     local_658.kstride * 8 +
                                     (iVar17 - local_658.begin.y) * local_658.jstride * 8 +
                                     (long)local_658.begin.x * -8 + local_5b0 + 8;
                            piVar47 = piVar31;
                            do {
                              if ((int)uVar5 <= iVar43) {
                                uVar48 = 0;
                                do {
                                  auVar65._8_4_ = (int)uVar48;
                                  auVar65._0_8_ = uVar48;
                                  auVar65._12_4_ = (int)(uVar48 >> 0x20);
                                  auVar63 = (auVar65 | auVar80) ^ auVar81;
                                  bVar12 = SUB164(local_308 ^ auVar81,0) < auVar63._0_4_;
                                  iVar49 = SUB164(local_308 ^ auVar81,4);
                                  iVar35 = auVar63._4_4_;
                                  if ((bool)(~(iVar49 < iVar35 || iVar35 == iVar49 && bVar12) & 1))
                                  {
                                    *(undefined8 *)(lVar53 + -8 + uVar48 * 8) = 0x3ff0000000000000;
                                  }
                                  if (iVar49 >= iVar35 && (iVar35 != iVar49 || !bVar12)) {
                                    *(undefined8 *)(lVar53 + uVar48 * 8) = 0x3ff0000000000000;
                                  }
                                  uVar48 = uVar48 + 2;
                                } while (local_3c8 != uVar48);
                              }
                              piVar47 = (int *)((long)piVar47 + 1);
                              lVar53 = lVar53 + local_658.kstride * 8;
                            } while (iVar19 != (int)piVar47);
                          }
                        }
                        else if ((iVar49 == 0x67) && ((int)uVar9 <= iVar35)) {
                          lVar53 = (long)local_658.p +
                                   local_658.nstride * local_710 +
                                   ((long)piVar31 - (long)local_658.begin.z) * local_658.kstride * 8
                                   + (iVar17 - local_658.begin.y) * local_658.jstride * 8 +
                                   (long)local_658.begin.x * -8 + local_5b0;
                          lVar33 = (long)local_5a8.p +
                                   ((long)piVar31 - (long)local_5a8.begin.z) * local_5a8.kstride * 4
                                   + (long)(uVar7 - local_5a8.begin.y) *
                                     CONCAT44(local_5a8.jstride._4_4_,(uint)local_5a8.jstride) * 4 +
                                   (long)local_5a8.begin.x * -4 + local_560;
                          piVar47 = piVar31;
                          do {
                            if ((int)uVar5 <= iVar43) {
                              lVar34 = 0;
                              do {
                                uVar59 = 0x3ff0000000000000;
                                if (*(int *)(lVar33 + lVar34 * 4) < 1) {
                                  uVar59 = 0;
                                }
                                *(undefined8 *)(lVar53 + lVar34 * 8) = uVar59;
                                lVar34 = lVar34 + 1;
                              } while ((int)local_410 != (int)lVar34);
                            }
                            piVar47 = (int *)((long)piVar47 + 1);
                            lVar53 = lVar53 + local_658.kstride * 8;
                            lVar33 = lVar33 + local_5a8.kstride * 4;
                          } while (iVar19 != (int)piVar47);
                        }
                        uVar48 = local_3f8;
                        if ((int)local_608 == 0x65) {
                          local_430[0] = -(double)pdVar1 * local_3b8;
                          local_430[1] = 0.5;
                          local_430[2] = 1.5;
                          local_430[3] = 2.5;
                          local_4b8 = ZEXT816(0);
                          local_4c8 = ZEXT816(0);
                          local_4d8 = ZEXT816(0);
                          local_4e8 = ZEXT816(0);
                          _local_4f8 = ZEXT816(0);
                          local_508 = ZEXT816(0);
                          if (1 < (int)local_510) {
                            lVar53 = 2;
                            uVar41 = 0;
                            do {
                              lVar33 = 0;
                              do {
                                lVar34 = 0;
                                dVar58 = 1.0;
                                dVar75 = 1.0;
                                do {
                                  if (lVar33 != lVar34) {
                                    dVar58 = dVar58 * (-0.5 - local_430[lVar34]);
                                    dVar75 = dVar75 * (local_430[lVar33] - local_430[lVar34]);
                                  }
                                  lVar34 = lVar34 + 1;
                                } while (lVar53 != lVar34);
                                *(double *)(local_508 + lVar33 * 8 + uVar41 * 0x20) =
                                     dVar58 / dVar75;
                                lVar33 = lVar33 + 1;
                              } while (lVar33 != lVar53);
                              uVar41 = uVar41 + 1;
                              lVar53 = lVar53 + 1;
                            } while (uVar41 != uVar48);
                          }
                          auVar63 = local_3d8;
                          if ((int)uVar10 <= iVar21) {
                            local_608 = (long)local_550.begin.z;
                            local_600 = local_550.p +
                                        (lVar24 - local_550.begin.y) *
                                        CONCAT44(local_550.jstride._4_4_,(uint)local_550.jstride);
                            local_3e8 = (double *)local_550.kstride;
                            local_5c0 = (double *)(long)local_698.begin.z;
                            local_5c8 = (double *)local_698.kstride;
                            local_5d0 = local_698.p +
                                        ((long)local_5d4 - (long)local_698.begin.y) *
                                        local_698.jstride + local_698.nstride * local_4a0;
                            local_6b8 = lVar25;
                            do {
                              if ((int)uVar6 <= iVar22) {
                                local_448._0_8_ = (long)local_488.begin.x;
                                lVar53 = lVar28;
                                do {
                                  if (local_600[(local_6b8 - local_608) * local_550.kstride +
                                                (lVar53 - local_550.begin.x)] < 1) {
                                    iVar49 = 1;
                                  }
                                  else {
                                    if (iVar13 < 2) {
                                      iVar49 = 1;
                                      bVar12 = false;
                                    }
                                    else {
                                      iVar49 = 1;
                                      lVar33 = 0;
                                      iVar35 = uVar8 - local_488.begin.y;
                                      bVar12 = false;
                                      do {
                                        dVar58 = local_488.p
                                                 [(local_6b8 - local_488.begin.z) *
                                                  local_488.kstride +
                                                  (lVar53 - local_488.begin.x) +
                                                  iVar35 * local_488.jstride];
                                        iVar49 = (uint)(0.0 < dVar58) + iVar49;
                                        bVar11 = bVar12;
                                        if (dVar58 < 1.0) {
                                          bVar11 = bVar4;
                                        }
                                        if (dVar58 <= 0.0) break;
                                        iVar35 = iVar35 + -1;
                                        bVar3 = lVar33 < lVar23;
                                        lVar33 = lVar33 + 1;
                                        bVar12 = bVar11;
                                      } while (bVar3);
                                    }
                                    if ((bVar12) && (1 < iVar49)) {
                                      iVar49 = 2;
                                    }
                                  }
                                  dVar58 = 0.0;
                                  if (iVar49 != 1) {
                                    dVar58 = *(double *)(local_508 + (long)(iVar49 * 4 + -7) * 8);
                                  }
                                  local_5d0[(local_6b8 - (long)local_5c0) * local_698.kstride +
                                            (lVar53 - local_698.begin.x)] = dVar58;
                                  lVar53 = lVar53 + 1;
                                } while (iVar16 != (int)lVar53);
                              }
                              local_6b8 = local_6b8 + 1;
                            } while (iVar20 != (int)local_6b8);
                          }
                        }
                        else {
                          auVar63 = local_3d8;
                          if ((int)local_608 == 0x66) {
                            if ((int)uVar10 <= iVar21) {
                              lVar33 = (long)local_698.p +
                                       local_698.nstride * local_710 +
                                       (lVar25 - local_698.begin.z) * local_698.kstride * 8 +
                                       (local_5d4 - local_698.begin.y) * local_698.jstride * 8 +
                                       (long)local_698.begin.x * -8 + local_5b8 + 8;
                              lVar53 = lVar25;
                              do {
                                if ((int)uVar6 <= iVar22) {
                                  uVar48 = 0;
                                  do {
                                    auVar69._8_4_ = (int)uVar48;
                                    auVar69._0_8_ = uVar48;
                                    auVar69._12_4_ = (int)(uVar48 >> 0x20);
                                    auVar61 = (auVar69 | auVar80) ^ auVar81;
                                    bVar4 = SUB164(auVar86 ^ auVar81,0) < auVar61._0_4_;
                                    iVar49 = SUB164(auVar86 ^ auVar81,4);
                                    iVar35 = auVar61._4_4_;
                                    if ((bool)(~(iVar49 < iVar35 || iVar35 == iVar49 && bVar4) & 1))
                                    {
                                      *(undefined8 *)(lVar33 + -8 + uVar48 * 8) = 0x3ff0000000000000
                                      ;
                                    }
                                    if (iVar49 >= iVar35 && (iVar35 != iVar49 || !bVar4)) {
                                      *(undefined8 *)(lVar33 + uVar48 * 8) = 0x3ff0000000000000;
                                    }
                                    uVar48 = uVar48 + 2;
                                  } while (local_3a8 != uVar48);
                                }
                                lVar53 = lVar53 + 1;
                                lVar33 = lVar33 + local_698.kstride * 8;
                              } while (iVar20 != (int)lVar53);
                            }
                          }
                          else if (((int)local_608 == 0x67) && ((int)uVar10 <= iVar21)) {
                            lVar33 = (long)local_698.p +
                                     local_698.nstride * local_710 +
                                     (lVar25 - local_698.begin.z) * local_698.kstride * 8 +
                                     (local_5d4 - local_698.begin.y) * local_698.jstride * 8 +
                                     (long)local_698.begin.x * -8 + local_5b8;
                            lVar34 = (long)local_550.p +
                                     (lVar25 - local_550.begin.z) * local_550.kstride * 4 +
                                     (long)(uVar8 - local_550.begin.y) *
                                     CONCAT44(local_550.jstride._4_4_,(uint)local_550.jstride) * 4 +
                                     (long)local_550.begin.x * -4 + local_568;
                            lVar53 = lVar25;
                            do {
                              if ((int)uVar6 <= iVar22) {
                                lVar37 = 0;
                                do {
                                  uVar59 = 0x3ff0000000000000;
                                  if (*(int *)(lVar34 + lVar37 * 4) < 1) {
                                    uVar59 = 0;
                                  }
                                  *(undefined8 *)(lVar33 + lVar37 * 8) = uVar59;
                                  lVar37 = lVar37 + 1;
                                } while ((int)local_3a0 != (int)lVar37);
                              }
                              lVar53 = lVar53 + 1;
                              lVar33 = lVar33 + local_698.kstride * 8;
                              lVar34 = lVar34 + local_550.kstride * 4;
                            } while (iVar20 != (int)lVar53);
                          }
                        }
                      }
                      else {
                        iVar51 = (int)local_5f0;
                        iVar44 = (int)local_5f8;
                        if (iVar79 == 0) {
                          if (iVar49 == 0x65) {
                            local_430[0] = -dVar58 * local_3b0;
                            local_430[1] = 0.5;
                            local_430[2] = 1.5;
                            local_430[3] = 2.5;
                            local_4b8 = ZEXT816(0);
                            local_4c8 = local_4b8;
                            local_4d8 = local_4b8;
                            local_4e8 = local_4b8;
                            _local_4f8 = local_4b8;
                            local_508 = local_4b8;
                            if (1 < (int)local_510) {
                              lVar53 = 2;
                              uVar41 = 0;
                              do {
                                lVar33 = 0;
                                do {
                                  lVar34 = 0;
                                  dVar58 = 1.0;
                                  dVar75 = 1.0;
                                  do {
                                    if (lVar33 != lVar34) {
                                      dVar58 = dVar58 * (-0.5 - local_430[lVar34]);
                                      dVar75 = dVar75 * (local_430[lVar33] - local_430[lVar34]);
                                    }
                                    lVar34 = lVar34 + 1;
                                  } while (lVar53 != lVar34);
                                  *(double *)(local_508 + lVar33 * 8 + uVar41 * 0x20) =
                                       dVar58 / dVar75;
                                  lVar33 = lVar33 + 1;
                                } while (lVar33 != lVar53);
                                uVar41 = uVar41 + 1;
                                lVar53 = lVar53 + 1;
                              } while (uVar41 != uVar48);
                            }
                            if ((int)uVar9 <= iVar35) {
                              local_5c8 = (double *)local_5a8.kstride;
                              local_5d0 = (double *)(long)local_5a8.begin.z;
                              local_5c0 = (double *)(local_5a8.p + (lVar29 - local_5a8.begin.x));
                              local_4a8 = (double *)local_658.kstride;
                              local_390 = (double *)(long)local_658.begin.z;
                              local_278 = local_658.p +
                                          (local_298 - local_658.begin.x) +
                                          local_658.nstride * local_4a0;
                              local_600 = piVar31;
                              do {
                                if ((int)uVar7 <= iVar51) {
                                  local_448._0_8_ = (long)local_488.begin.y;
                                  lVar53 = lVar30;
                                  do {
                                    if (*(int *)((long)local_5c0 +
                                                (lVar53 - local_5a8.begin.y) *
                                                CONCAT44(local_5a8.jstride._4_4_,
                                                         (uint)local_5a8.jstride) * 4 +
                                                ((long)local_600 - (long)local_5d0) *
                                                local_5a8.kstride * 4) < 1) {
                                      iVar49 = 1;
                                    }
                                    else {
                                      if (iVar13 < 2) {
                                        iVar49 = 1;
                                        bVar12 = false;
                                      }
                                      else {
                                        iVar49 = 1;
                                        lVar33 = 0;
                                        bVar12 = false;
                                        do {
                                          dVar58 = local_488.p
                                                   [((long)local_600 - (long)local_488.begin.z) *
                                                    local_488.kstride +
                                                    (lVar53 - local_488.begin.y) * local_488.jstride
                                                    + (long)((int)lVar33 +
                                                            (local_37c - local_488.begin.x))];
                                          iVar49 = (uint)(0.0 < dVar58) + iVar49;
                                          bVar11 = bVar12;
                                          if (dVar58 < 1.0) {
                                            bVar11 = true;
                                          }
                                        } while ((0.0 < dVar58) &&
                                                (bVar3 = lVar33 < lVar23, lVar33 = lVar33 + 1,
                                                bVar12 = bVar11, bVar3));
                                      }
                                      if ((bVar12) && (1 < iVar49)) {
                                        iVar49 = 2;
                                      }
                                    }
                                    dVar58 = 0.0;
                                    if (iVar49 != 1) {
                                      dVar58 = *(double *)(local_508 + (long)(iVar49 * 4 + -7) * 8);
                                    }
                                    (local_658.p +
                                    (local_298 - local_658.begin.x) + local_658.nstride * local_4a0)
                                    [((long)local_600 - (long)local_658.begin.z) * local_658.kstride
                                     + (lVar53 - local_658.begin.y) * local_658.jstride] = dVar58;
                                    lVar53 = lVar53 + 1;
                                  } while (iVar15 != (int)lVar53);
                                }
                                local_600 = (int *)((long)local_600 + 1);
                              } while (iVar19 != (int)local_600);
                            }
                          }
                          else if (iVar49 == 0x66) {
                            if ((int)uVar9 <= iVar35) {
                              lVar53 = local_658.kstride * 8;
                              lVar34 = ((long)piVar31 - (long)local_658.begin.z) * lVar53;
                              lVar33 = (long)local_658.p +
                                       (lVar30 - local_658.begin.y) * local_658.jstride * 8 + lVar34
                                       + local_658.nstride * local_710 +
                                       (long)local_658.begin.x * -8 + local_400;
                              lVar34 = (long)local_658.p +
                                       (local_360 - local_658.begin.y) * local_658.jstride * 8 +
                                       lVar34 + local_658.nstride * local_710 +
                                       (long)local_658.begin.x * -8 + local_400;
                              piVar47 = piVar31;
                              do {
                                if ((int)uVar7 <= iVar51) {
                                  lVar37 = 0;
                                  uVar48 = 0;
                                  do {
                                    auVar62._8_4_ = (int)uVar48;
                                    auVar62._0_8_ = uVar48;
                                    auVar62._12_4_ = (int)(uVar48 >> 0x20);
                                    auVar63 = (auVar62 | auVar80) ^ auVar81;
                                    bVar12 = SUB164(local_2e8 ^ auVar81,0) < auVar63._0_4_;
                                    iVar49 = SUB164(local_2e8 ^ auVar81,4);
                                    iVar35 = auVar63._4_4_;
                                    if ((bool)(~(iVar49 < iVar35 || iVar35 == iVar49 && bVar12) & 1)
                                       ) {
                                      *(undefined8 *)(lVar33 + lVar37) = 0x3ff0000000000000;
                                    }
                                    if (iVar49 >= iVar35 && (iVar35 != iVar49 || !bVar12)) {
                                      *(undefined8 *)(lVar34 + lVar37) = 0x3ff0000000000000;
                                    }
                                    uVar48 = uVar48 + 2;
                                    lVar37 = lVar37 + local_658.jstride * 0x10;
                                  } while (local_358 != uVar48);
                                }
                                piVar47 = (int *)((long)piVar47 + 1);
                                lVar33 = lVar33 + lVar53;
                                lVar34 = lVar34 + lVar53;
                              } while (iVar19 != (int)piVar47);
                            }
                          }
                          else if ((iVar49 == 0x67) && ((int)uVar9 <= iVar35)) {
                            puVar36 = (undefined8 *)
                                      ((long)local_658.p +
                                      local_658.nstride * local_710 +
                                      ((long)piVar31 - (long)local_658.begin.z) *
                                      local_658.kstride * 8 +
                                      (lVar30 - local_658.begin.y) * local_658.jstride * 8 +
                                      (long)local_658.begin.x * -8 + local_400);
                            piVar40 = (int *)((long)local_5a8.p +
                                             ((long)piVar31 - (long)local_5a8.begin.z) *
                                             local_5a8.kstride * 4 +
                                             (lVar30 - local_5a8.begin.y) *
                                             CONCAT44(local_5a8.jstride._4_4_,
                                                      (uint)local_5a8.jstride) * 4 +
                                             (long)local_5a8.begin.x * -4 + local_560);
                            piVar47 = piVar31;
                            do {
                              piVar50 = piVar40;
                              puVar54 = puVar36;
                              iVar49 = local_490;
                              if ((int)uVar7 <= iVar51) {
                                do {
                                  uVar59 = 0x3ff0000000000000;
                                  if (*piVar50 < 1) {
                                    uVar59 = 0;
                                  }
                                  *puVar54 = uVar59;
                                  puVar54 = puVar54 + local_658.jstride;
                                  piVar50 = piVar50 + CONCAT44(local_5a8.jstride._4_4_,
                                                               (uint)local_5a8.jstride);
                                  iVar49 = iVar49 + -1;
                                } while (iVar49 != 0);
                              }
                              piVar47 = (int *)((long)piVar47 + 1);
                              puVar36 = puVar36 + local_658.kstride;
                              piVar40 = piVar40 + local_5a8.kstride;
                            } while (iVar19 != (int)piVar47);
                          }
                          uVar48 = local_3f8;
                          if ((int)local_608 == 0x65) {
                            local_430[0] = -(double)pdVar1 * local_3b0;
                            local_430[1] = 0.5;
                            local_430[2] = 1.5;
                            local_430[3] = 2.5;
                            local_4b8 = ZEXT816(0);
                            local_4c8 = ZEXT816(0);
                            local_4d8 = ZEXT816(0);
                            local_4e8 = ZEXT816(0);
                            _local_4f8 = ZEXT816(0);
                            local_508 = ZEXT816(0);
                            if (1 < (int)local_510) {
                              lVar53 = 2;
                              uVar41 = 0;
                              do {
                                lVar33 = 0;
                                do {
                                  lVar34 = 0;
                                  dVar58 = 1.0;
                                  dVar75 = 1.0;
                                  do {
                                    if (lVar33 != lVar34) {
                                      dVar58 = dVar58 * (-0.5 - local_430[lVar34]);
                                      dVar75 = dVar75 * (local_430[lVar33] - local_430[lVar34]);
                                    }
                                    lVar34 = lVar34 + 1;
                                  } while (lVar53 != lVar34);
                                  *(double *)(local_508 + lVar33 * 8 + uVar41 * 0x20) =
                                       dVar58 / dVar75;
                                  lVar33 = lVar33 + 1;
                                } while (lVar33 != lVar53);
                                uVar41 = uVar41 + 1;
                                lVar53 = lVar53 + 1;
                              } while (uVar41 != uVar48);
                            }
                            auVar63 = local_3d8;
                            if ((int)uVar10 <= iVar21) {
                              local_5c0 = (double *)local_550.kstride;
                              local_5c8 = (double *)(long)local_550.begin.z;
                              local_3e8 = (double *)(local_550.p + (lVar28 - local_550.begin.x));
                              local_5d0 = (double *)local_698.kstride;
                              local_4a8 = (double *)(long)local_698.begin.z;
                              local_390 = local_698.p +
                                          (local_2a0 - local_698.begin.x) +
                                          local_698.nstride * local_4a0;
                              local_608 = lVar25;
                              do {
                                if ((int)uVar8 <= iVar44) {
                                  local_448._0_8_ = (long)local_488.begin.y;
                                  local_600 = (int *)CONCAT44(local_600._4_4_,
                                                              uVar6 - local_488.begin.x);
                                  lVar53 = lVar24;
                                  do {
                                    if (*(int *)((long)(local_550.p + (lVar28 - local_550.begin.x))
                                                + (lVar53 - local_550.begin.y) *
                                                  CONCAT44(local_550.jstride._4_4_,
                                                           (uint)local_550.jstride) * 4 +
                                                  (local_608 - (long)local_5c8) * local_550.kstride
                                                  * 4) < 1) {
                                      iVar49 = 1;
                                    }
                                    else {
                                      if (iVar13 < 2) {
                                        iVar49 = 1;
                                        bVar12 = false;
                                      }
                                      else {
                                        iVar49 = 1;
                                        lVar33 = 0;
                                        iVar35 = uVar6 - local_488.begin.x;
                                        bVar12 = false;
                                        do {
                                          dVar58 = local_488.p
                                                   [(local_608 - local_488.begin.z) *
                                                    local_488.kstride +
                                                    (lVar53 - local_488.begin.y) * local_488.jstride
                                                    + (long)iVar35];
                                          iVar49 = (uint)(0.0 < dVar58) + iVar49;
                                          bVar11 = bVar12;
                                          if (dVar58 < 1.0) {
                                            bVar11 = bVar4;
                                          }
                                          if (dVar58 <= 0.0) break;
                                          iVar35 = iVar35 + -1;
                                          bVar3 = lVar33 < lVar23;
                                          lVar33 = lVar33 + 1;
                                          bVar12 = bVar11;
                                        } while (bVar3);
                                      }
                                      if ((bVar12) && (1 < iVar49)) {
                                        iVar49 = 2;
                                      }
                                    }
                                    dVar58 = 0.0;
                                    if (iVar49 != 1) {
                                      dVar58 = *(double *)(local_508 + (long)(iVar49 * 4 + -7) * 8);
                                    }
                                    (local_698.p +
                                    (local_2a0 - local_698.begin.x) + local_698.nstride * local_4a0)
                                    [(local_608 - local_698.begin.z) * local_698.kstride +
                                     (lVar53 - local_698.begin.y) * local_698.jstride] = dVar58;
                                    lVar53 = lVar53 + 1;
                                  } while (iVar14 != (int)lVar53);
                                }
                                local_608 = local_608 + 1;
                              } while (iVar20 != (int)local_608);
                            }
                          }
                          else {
                            auVar63 = local_3d8;
                            if ((int)local_608 == 0x66) {
                              if ((int)uVar10 <= iVar21) {
                                lVar33 = local_698.kstride * 8;
                                lVar53 = (lVar25 - local_698.begin.z) * lVar33;
                                lVar34 = (long)local_698.p +
                                         (lVar24 - local_698.begin.y) * local_698.jstride * 8 +
                                         lVar53 + local_698.nstride * local_710 +
                                         (long)local_698.begin.x * -8 + local_408;
                                lVar37 = (long)local_698.p +
                                         (local_368 - local_698.begin.y) * local_698.jstride * 8 +
                                         lVar53 + local_698.nstride * local_710 +
                                         (long)local_698.begin.x * -8 + local_408;
                                lVar53 = lVar25;
                                do {
                                  if ((int)uVar8 <= iVar44) {
                                    lVar45 = 0;
                                    uVar48 = 0;
                                    do {
                                      auVar66._8_4_ = (int)uVar48;
                                      auVar66._0_8_ = uVar48;
                                      auVar66._12_4_ = (int)(uVar48 >> 0x20);
                                      auVar61 = (auVar66 | auVar80) ^ auVar81;
                                      bVar4 = SUB164(auVar84 ^ auVar81,0) < auVar61._0_4_;
                                      iVar49 = SUB164(auVar84 ^ auVar81,4);
                                      iVar35 = auVar61._4_4_;
                                      if ((bool)(~(iVar49 < iVar35 || iVar35 == iVar49 && bVar4) & 1
                                                )) {
                                        *(undefined8 *)(lVar34 + lVar45) = 0x3ff0000000000000;
                                      }
                                      if (iVar49 >= iVar35 && (iVar35 != iVar49 || !bVar4)) {
                                        *(undefined8 *)(lVar37 + lVar45) = 0x3ff0000000000000;
                                      }
                                      uVar48 = uVar48 + 2;
                                      lVar45 = lVar45 + local_698.jstride * 0x10;
                                    } while (local_340 != uVar48);
                                  }
                                  lVar53 = lVar53 + 1;
                                  lVar34 = lVar34 + lVar33;
                                  lVar37 = lVar37 + lVar33;
                                } while (iVar20 != (int)lVar53);
                              }
                            }
                            else if (((int)local_608 == 0x67) && ((int)uVar10 <= iVar21)) {
                              puVar36 = (undefined8 *)
                                        ((long)local_698.p +
                                        local_698.nstride * local_710 +
                                        (lVar25 - local_698.begin.z) * local_698.kstride * 8 +
                                        (lVar24 - local_698.begin.y) * local_698.jstride * 8 +
                                        (long)local_698.begin.x * -8 + local_408);
                              piVar47 = (int *)((long)local_550.p +
                                               (lVar25 - local_550.begin.z) * local_550.kstride * 4
                                               + (lVar24 - local_550.begin.y) *
                                                 CONCAT44(local_550.jstride._4_4_,
                                                          (uint)local_550.jstride) * 4 +
                                               (long)local_550.begin.x * -4 + local_568);
                              lVar53 = lVar25;
                              do {
                                piVar40 = piVar47;
                                puVar54 = puVar36;
                                iVar49 = local_494;
                                if ((int)uVar8 <= iVar44) {
                                  do {
                                    uVar59 = 0x3ff0000000000000;
                                    if (*piVar40 < 1) {
                                      uVar59 = 0;
                                    }
                                    *puVar54 = uVar59;
                                    puVar54 = puVar54 + local_698.jstride;
                                    piVar40 = piVar40 + CONCAT44(local_550.jstride._4_4_,
                                                                 (uint)local_550.jstride);
                                    iVar49 = iVar49 + -1;
                                  } while (iVar49 != 0);
                                }
                                lVar53 = lVar53 + 1;
                                puVar36 = puVar36 + local_698.kstride;
                                piVar47 = piVar47 + local_550.kstride;
                              } while (iVar20 != (int)lVar53);
                            }
                          }
                        }
                        else {
                          if (iVar49 == 0x65) {
                            local_430[0] = (double)((ulong)dVar58 ^ (ulong)DAT_0077bb00) * local_3c0
                            ;
                            local_430[1] = 0.5;
                            local_430[2] = 1.5;
                            local_430[3] = 2.5;
                            local_4b8 = ZEXT816(0);
                            local_4c8 = local_4b8;
                            local_4d8 = local_4b8;
                            local_4e8 = local_4b8;
                            _local_4f8 = local_4b8;
                            local_508 = local_4b8;
                            if (1 < (int)local_510) {
                              lVar53 = 2;
                              uVar41 = 0;
                              do {
                                lVar33 = 0;
                                do {
                                  lVar34 = 0;
                                  dVar58 = 1.0;
                                  dVar75 = 1.0;
                                  do {
                                    if (lVar33 != lVar34) {
                                      dVar58 = dVar58 * (-0.5 - local_430[lVar34]);
                                      dVar75 = dVar75 * (local_430[lVar33] - local_430[lVar34]);
                                    }
                                    lVar34 = lVar34 + 1;
                                  } while (lVar53 != lVar34);
                                  *(double *)(local_508 + lVar33 * 8 + uVar41 * 0x20) =
                                       dVar58 / dVar75;
                                  lVar33 = lVar33 + 1;
                                } while (lVar33 != lVar53);
                                uVar41 = uVar41 + 1;
                                lVar53 = lVar53 + 1;
                              } while (uVar41 != uVar48);
                            }
                            if ((int)uVar7 <= iVar51) {
                              local_600 = (int *)(long)local_5a8.begin.y;
                              local_5c0 = (double *)
                                          CONCAT44(local_5a8.jstride._4_4_,(uint)local_5a8.jstride);
                              local_5c8 = (double *)(long)local_658.begin.y;
                              local_5d0 = (double *)local_658.jstride;
                              local_4a8 = local_658.p +
                                          ((long)iVar18 - (long)local_658.begin.z) *
                                          local_658.kstride + local_658.nstride * local_4a0;
                              local_6b0 = (int *)lVar30;
                              do {
                                if ((int)uVar5 <= iVar43) {
                                  local_448._0_8_ = (long)local_488.begin.x;
                                  lVar53 = lVar29;
                                  do {
                                    if (local_5a8.p
                                        [((long)piVar31 - (long)local_5a8.begin.z) *
                                         local_5a8.kstride +
                                         ((long)local_6b0 - (long)local_600) * (long)local_5c0 +
                                         (lVar53 - local_5a8.begin.x)] < 1) {
                                      iVar49 = 1;
                                    }
                                    else {
                                      if (iVar13 < 2) {
                                        iVar49 = 1;
                                        bVar12 = false;
                                      }
                                      else {
                                        iVar49 = 1;
                                        lVar33 = 0;
                                        bVar12 = false;
                                        do {
                                          dVar58 = local_488.p
                                                   [((long)local_6b0 - (long)local_488.begin.y) *
                                                    local_488.jstride +
                                                    (lVar53 - local_488.begin.x) +
                                                    ((int)lVar33 + (iVar18 - local_488.begin.z)) *
                                                    local_488.kstride];
                                          iVar49 = (uint)(0.0 < dVar58) + iVar49;
                                          bVar11 = bVar12;
                                          if (dVar58 < 1.0) {
                                            bVar11 = bVar4;
                                          }
                                        } while ((0.0 < dVar58) &&
                                                (bVar3 = lVar33 < lVar23, lVar33 = lVar33 + 1,
                                                bVar12 = bVar11, bVar3));
                                      }
                                      if ((bVar12) && (1 < iVar49)) {
                                        iVar49 = 2;
                                      }
                                    }
                                    dVar58 = 0.0;
                                    if (iVar49 != 1) {
                                      dVar58 = *(double *)(local_508 + (long)(iVar49 * 4 + -7) * 8);
                                    }
                                    (local_658.p +
                                    ((long)iVar18 - (long)local_658.begin.z) * local_658.kstride +
                                    local_658.nstride * local_4a0)
                                    [((long)local_6b0 - (long)local_5c8) * local_658.jstride +
                                     (lVar53 - local_658.begin.x)] = dVar58;
                                    lVar53 = lVar53 + 1;
                                  } while (local_48c != (int)lVar53);
                                }
                                local_6b0 = (int *)((long)local_6b0 + 1);
                              } while (iVar15 != (int)local_6b0);
                            }
                          }
                          else if (iVar49 == 0x66) {
                            if ((int)uVar7 <= iVar51) {
                              lVar33 = (long)local_658.p +
                                       local_658.nstride * local_710 +
                                       (lVar30 - local_658.begin.y) * local_658.jstride * 8 +
                                       (iVar18 - local_658.begin.z) * local_658.kstride * 8 +
                                       (long)local_658.begin.x * -8 + local_5b0 + 8;
                              lVar53 = lVar30;
                              do {
                                if ((int)uVar5 <= iVar43) {
                                  uVar48 = 0;
                                  do {
                                    auVar71._8_4_ = (int)uVar48;
                                    auVar71._0_8_ = uVar48;
                                    auVar71._12_4_ = (int)(uVar48 >> 0x20);
                                    auVar63 = (auVar71 | auVar80) ^ auVar81;
                                    bVar12 = SUB164(local_2d8 ^ auVar81,0) < auVar63._0_4_;
                                    iVar49 = SUB164(local_2d8 ^ auVar81,4);
                                    iVar35 = auVar63._4_4_;
                                    if ((bool)(~(iVar49 < iVar35 || iVar35 == iVar49 && bVar12) & 1)
                                       ) {
                                      *(undefined8 *)(lVar33 + -8 + uVar48 * 8) = 0x3ff0000000000000
                                      ;
                                    }
                                    if (iVar49 >= iVar35 && (iVar35 != iVar49 || !bVar12)) {
                                      *(undefined8 *)(lVar33 + uVar48 * 8) = 0x3ff0000000000000;
                                    }
                                    uVar48 = uVar48 + 2;
                                  } while (local_3c8 != uVar48);
                                }
                                lVar53 = lVar53 + 1;
                                lVar33 = lVar33 + local_658.jstride * 8;
                              } while (iVar15 != (int)lVar53);
                            }
                          }
                          else if ((iVar49 == 0x67) && ((int)uVar7 <= iVar51)) {
                            lVar33 = (long)local_658.p +
                                     local_658.nstride * local_710 +
                                     (lVar30 - local_658.begin.y) * local_658.jstride * 8 +
                                     (iVar18 - local_658.begin.z) * local_658.kstride * 8 +
                                     (long)local_658.begin.x * -8 + local_5b0;
                            lVar34 = CONCAT44(local_5a8.jstride._4_4_,(uint)local_5a8.jstride) * 4;
                            lVar37 = (long)local_5a8.p +
                                     (lVar30 - local_5a8.begin.y) * lVar34 +
                                     (uVar9 - local_5a8.begin.z) * local_5a8.kstride * 4 +
                                     (long)local_5a8.begin.x * -4 + local_560;
                            lVar53 = lVar30;
                            do {
                              if ((int)uVar5 <= iVar43) {
                                lVar45 = 0;
                                do {
                                  uVar59 = 0x3ff0000000000000;
                                  if (*(int *)(lVar37 + lVar45 * 4) < 1) {
                                    uVar59 = 0;
                                  }
                                  *(undefined8 *)(lVar33 + lVar45 * 8) = uVar59;
                                  lVar45 = lVar45 + 1;
                                } while ((int)local_410 != (int)lVar45);
                              }
                              lVar53 = lVar53 + 1;
                              lVar33 = lVar33 + local_658.jstride * 8;
                              lVar37 = lVar37 + lVar34;
                            } while (iVar15 != (int)lVar53);
                          }
                          uVar48 = local_3f8;
                          if ((int)local_608 == 0x65) {
                            local_430[0] = -(double)pdVar1 * local_3c0;
                            local_430[1] = 0.5;
                            local_430[2] = 1.5;
                            local_430[3] = 2.5;
                            local_4b8 = ZEXT816(0);
                            local_4c8 = ZEXT816(0);
                            local_4d8 = ZEXT816(0);
                            local_4e8 = ZEXT816(0);
                            _local_4f8 = ZEXT816(0);
                            local_508 = ZEXT816(0);
                            if (1 < (int)local_510) {
                              lVar53 = 2;
                              uVar41 = 0;
                              do {
                                lVar33 = 0;
                                do {
                                  lVar34 = 0;
                                  dVar58 = 1.0;
                                  dVar75 = 1.0;
                                  do {
                                    if (lVar33 != lVar34) {
                                      dVar58 = dVar58 * (-0.5 - local_430[lVar34]);
                                      dVar75 = dVar75 * (local_430[lVar33] - local_430[lVar34]);
                                    }
                                    lVar34 = lVar34 + 1;
                                  } while (lVar53 != lVar34);
                                  *(double *)(local_508 + lVar33 * 8 + uVar41 * 0x20) =
                                       dVar58 / dVar75;
                                  lVar33 = lVar33 + 1;
                                } while (lVar33 != lVar53);
                                uVar41 = uVar41 + 1;
                                lVar53 = lVar53 + 1;
                              } while (uVar41 != uVar48);
                            }
                            auVar63 = local_3d8;
                            if ((int)uVar8 <= iVar44) {
                              local_608 = (long)local_550.begin.y;
                              local_600 = local_550.p +
                                          (lVar25 - local_550.begin.z) * local_550.kstride;
                              local_3e8 = (double *)
                                          CONCAT44(local_550.jstride._4_4_,(uint)local_550.jstride);
                              local_5c0 = (double *)(long)local_698.begin.y;
                              local_5c8 = (double *)local_698.jstride;
                              local_5d0 = local_698.p +
                                          ((long)local_5d8 - (long)local_698.begin.z) *
                                          local_698.kstride + local_698.nstride * local_4a0;
                              local_6b8 = lVar24;
                              do {
                                if ((int)uVar6 <= iVar22) {
                                  local_448._0_8_ = (long)local_488.begin.x;
                                  lVar53 = lVar28;
                                  do {
                                    if (local_600[(local_6b8 - local_608) *
                                                  (long)CONCAT44(local_550.jstride._4_4_,
                                                                 (uint)local_550.jstride) +
                                                  (lVar53 - local_550.begin.x)] < 1) {
                                      iVar49 = 1;
                                    }
                                    else {
                                      if (iVar13 < 2) {
                                        iVar49 = 1;
                                        bVar12 = false;
                                      }
                                      else {
                                        iVar49 = 1;
                                        lVar33 = 0;
                                        iVar35 = uVar10 - local_488.begin.z;
                                        bVar12 = false;
                                        do {
                                          dVar58 = local_488.p
                                                   [(local_6b8 - local_488.begin.y) *
                                                    local_488.jstride +
                                                    (lVar53 - local_488.begin.x) +
                                                    iVar35 * local_488.kstride];
                                          iVar49 = (uint)(0.0 < dVar58) + iVar49;
                                          bVar11 = bVar12;
                                          if (dVar58 < 1.0) {
                                            bVar11 = bVar4;
                                          }
                                          if (dVar58 <= 0.0) break;
                                          iVar35 = iVar35 + -1;
                                          bVar3 = lVar33 < lVar23;
                                          lVar33 = lVar33 + 1;
                                          bVar12 = bVar11;
                                        } while (bVar3);
                                      }
                                      if ((bVar12) && (1 < iVar49)) {
                                        iVar49 = 2;
                                      }
                                    }
                                    dVar58 = 0.0;
                                    if (iVar49 != 1) {
                                      dVar58 = *(double *)(local_508 + (long)(iVar49 * 4 + -7) * 8);
                                    }
                                    local_5d0[(local_6b8 - (long)local_5c0) * local_698.jstride +
                                              (lVar53 - local_698.begin.x)] = dVar58;
                                    lVar53 = lVar53 + 1;
                                  } while (iVar16 != (int)lVar53);
                                }
                                local_6b8 = local_6b8 + 1;
                              } while (iVar14 != (int)local_6b8);
                            }
                          }
                          else {
                            auVar63 = local_3d8;
                            if ((int)local_608 == 0x66) {
                              if ((int)uVar8 <= iVar44) {
                                lVar33 = (long)local_698.p +
                                         local_698.nstride * local_710 +
                                         (lVar24 - local_698.begin.y) * local_698.jstride * 8 +
                                         (local_5d8 - local_698.begin.z) * local_698.kstride * 8 +
                                         (long)local_698.begin.x * -8 + local_5b8 + 8;
                                lVar53 = lVar24;
                                do {
                                  if ((int)uVar6 <= iVar22) {
                                    uVar48 = 0;
                                    do {
                                      auVar73._8_4_ = (int)uVar48;
                                      auVar73._0_8_ = uVar48;
                                      auVar73._12_4_ = (int)(uVar48 >> 0x20);
                                      auVar61 = (auVar73 | auVar80) ^ auVar81;
                                      bVar4 = SUB164(local_3d8 ^ auVar81,0) < auVar61._0_4_;
                                      iVar49 = SUB164(local_3d8 ^ auVar81,4);
                                      iVar35 = auVar61._4_4_;
                                      if ((bool)(~(iVar49 < iVar35 || iVar35 == iVar49 && bVar4) & 1
                                                )) {
                                        *(undefined8 *)(lVar33 + -8 + uVar48 * 8) =
                                             0x3ff0000000000000;
                                      }
                                      if (iVar49 >= iVar35 && (iVar35 != iVar49 || !bVar4)) {
                                        *(undefined8 *)(lVar33 + uVar48 * 8) = 0x3ff0000000000000;
                                      }
                                      uVar48 = uVar48 + 2;
                                    } while (local_3a8 != uVar48);
                                  }
                                  lVar53 = lVar53 + 1;
                                  lVar33 = lVar33 + local_698.jstride * 8;
                                } while (iVar14 != (int)lVar53);
                              }
                            }
                            else if (((int)local_608 == 0x67) && ((int)uVar8 <= iVar44)) {
                              lVar33 = (long)local_698.p +
                                       local_698.nstride * local_710 +
                                       (lVar24 - local_698.begin.y) * local_698.jstride * 8 +
                                       (local_5d8 - local_698.begin.z) * local_698.kstride * 8 +
                                       (long)local_698.begin.x * -8 + local_5b8;
                              lVar34 = CONCAT44(local_550.jstride._4_4_,(uint)local_550.jstride) * 4
                              ;
                              lVar37 = (long)local_550.p +
                                       (lVar24 - local_550.begin.y) * lVar34 +
                                       (uVar10 - local_550.begin.z) * local_550.kstride * 4 +
                                       (long)local_550.begin.x * -4 + local_568;
                              lVar53 = lVar24;
                              do {
                                if ((int)uVar6 <= iVar22) {
                                  lVar45 = 0;
                                  do {
                                    uVar59 = 0x3ff0000000000000;
                                    if (*(int *)(lVar37 + lVar45 * 4) < 1) {
                                      uVar59 = 0;
                                    }
                                    *(undefined8 *)(lVar33 + lVar45 * 8) = uVar59;
                                    lVar45 = lVar45 + 1;
                                  } while ((int)local_3a0 != (int)lVar45);
                                }
                                lVar53 = lVar53 + 1;
                                lVar33 = lVar33 + local_698.jstride * 8;
                                lVar37 = lVar37 + lVar34;
                              } while (iVar14 != (int)lVar53);
                            }
                          }
                        }
                      }
                    }
                    uVar26 = local_4a0 + 1;
                    local_710 = local_710 + 8;
                    uVar41 = local_388;
                    uVar48 = local_290;
                  } while (uVar26 != local_270);
                }
              }
              uVar41 = uVar41 + 1;
            } while (uVar41 != 3);
            MFIter::operator++(&local_258);
          }
          MFIter::~MFIter(&local_258);
          MultiFab::~MultiFab(&local_1b0);
          lVar23 = local_370 + 1;
          this = local_2c0;
        } while (lVar23 < (local_2c0->super_MLLinOp).m_num_mg_levels.
                          super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[local_2b8]);
      }
      local_2b8 = local_2b8 + 1;
    } while (local_2b8 < (this->super_MLLinOp).m_num_amr_levels);
  }
  return;
}

Assistant:

void
MLCellLinOp::prepareForSolve ()
{
    BL_PROFILE("MLCellLinOp::prepareForSolve()");

    const int imaxorder = maxorder;
    const int ncomp = getNComp();
    const int hidden_direction = hiddenDirection();
    for (int amrlev = 0;  amrlev < m_num_amr_levels; ++amrlev)
    {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            const auto& bcondloc = *m_bcondloc[amrlev][mglev];
            const auto& maskvals = m_maskvals[amrlev][mglev];

            const Real dxi = m_geom[amrlev][mglev].InvCellSize(0);
            const Real dyi = (AMREX_SPACEDIM >= 2) ? m_geom[amrlev][mglev].InvCellSize(1) : Real(1.0);
            const Real dzi = (AMREX_SPACEDIM == 3) ? m_geom[amrlev][mglev].InvCellSize(2) : Real(1.0);

            BndryRegister& undrrelxr = m_undrrelxr[amrlev][mglev];
            MultiFab foo(m_grids[amrlev][mglev], m_dmap[amrlev][mglev], ncomp, 0, MFInfo().SetAlloc(false));

#ifdef AMREX_USE_EB
            auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
            const FabArray<EBCellFlagFab>* flags =
                (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
            auto area = (factory) ? factory->getAreaFrac()
                : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};
#endif

#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion()) {
#ifdef AMREX_USE_EB
                if (factory) {
                    Vector<PSEBTag> tags;
                    tags.reserve(foo.local_size()*AMREX_SPACEDIM*ncomp);

                    for (MFIter mfi(foo); mfi.isValid(); ++mfi)
                    {
                        const Box& vbx = mfi.validbox();

                        const auto & bdlv = bcondloc.bndryLocs(mfi);
                        const auto & bdcv = bcondloc.bndryConds(mfi);

                        auto fabtyp = (flags) ? (*flags)[mfi].getType(vbx) : FabType::regular;

                        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
                        {
                            if (idim != hidden_direction && fabtyp != FabType::covered) {
                                const Orientation olo(idim,Orientation::low);
                                const Orientation ohi(idim,Orientation::high);
                                auto const& ap = (fabtyp == FabType::singlevalued)
                                    ? area[idim]->const_array(mfi) : Array4<Real const>{};
                                for (int icomp = 0; icomp < ncomp; ++icomp) {
                                    tags.emplace_back(PSEBTag{undrrelxr[olo].array(mfi),
                                                              undrrelxr[ohi].array(mfi),
                                                              ap,
                                                              maskvals[olo].const_array(mfi),
                                                              maskvals[ohi].const_array(mfi),
                                                              bdlv[icomp][olo], bdlv[icomp][ohi],
                                                              amrex::adjCell(vbx,olo),
                                                              bdcv[icomp][olo], bdcv[icomp][ohi],
                                                              vbx.length(idim), icomp, idim});
                                }
                            }
                        }
                    }

                    ParallelFor(tags,
                    [=] AMREX_GPU_DEVICE (int i, int j, int k, PSEBTag const& tag) noexcept
                    {
                        if (tag.ap) {
                            if (tag.dir == 0)
                            {
                                mllinop_comp_interp_coef0_x_eb
                                    (0, i           , j, k, tag.blen, tag.flo, tag.mlo, tag.ap,
                                     tag.bctlo, tag.bcllo, imaxorder, dxi, tag.comp);
                                mllinop_comp_interp_coef0_x_eb
                                    (1, i+tag.blen+1, j, k, tag.blen, tag.fhi, tag.mhi, tag.ap,
                                     tag.bcthi, tag.bclhi, imaxorder, dxi, tag.comp);
                            }
#if (AMREX_SPACEDIM > 1)
                            else
#if (AMREX_SPACEDIM > 2)
                            if (tag.dir == 1)
#endif
                            {
                                mllinop_comp_interp_coef0_y_eb
                                    (0, i, j           , k, tag.blen, tag.flo, tag.mlo, tag.ap,
                                     tag.bctlo, tag.bcllo, imaxorder, dyi, tag.comp);
                                mllinop_comp_interp_coef0_y_eb
                                    (1, i, j+tag.blen+1, k, tag.blen, tag.fhi, tag.mhi, tag.ap,
                                     tag.bcthi, tag.bclhi, imaxorder, dyi, tag.comp);
                            }
#if (AMREX_SPACEDIM > 2)
                            else {
                                mllinop_comp_interp_coef0_z_eb
                                    (0, i, j, k           , tag.blen, tag.flo, tag.mlo, tag.ap,
                                     tag.bctlo, tag.bcllo, imaxorder, dzi, tag.comp);
                                mllinop_comp_interp_coef0_z_eb
                                    (1, i, j, k+tag.blen+1, tag.blen, tag.fhi, tag.mhi, tag.ap,
                                     tag.bcthi, tag.bclhi, imaxorder, dzi, tag.comp);
                            }
#endif
#endif
                        } else {
                            if (tag.dir == 0)
                            {
                                mllinop_comp_interp_coef0_x
                                    (0, i           , j, k, tag.blen, tag.flo, tag.mlo,
                                     tag.bctlo, tag.bcllo, imaxorder, dxi, tag.comp);
                                mllinop_comp_interp_coef0_x
                                    (1, i+tag.blen+1, j, k, tag.blen, tag.fhi, tag.mhi,
                                     tag.bcthi, tag.bclhi, imaxorder, dxi, tag.comp);
                            }
#if (AMREX_SPACEDIM > 1)
                            else
#if (AMREX_SPACEDIM > 2)
                            if (tag.dir == 1)
#endif
                            {
                                mllinop_comp_interp_coef0_y
                                    (0, i, j           , k, tag.blen, tag.flo, tag.mlo,
                                     tag.bctlo, tag.bcllo, imaxorder, dyi, tag.comp);
                                mllinop_comp_interp_coef0_y
                                    (1, i, j+tag.blen+1, k, tag.blen, tag.fhi, tag.mhi,
                                     tag.bcthi, tag.bclhi, imaxorder, dyi, tag.comp);
                            }
#if (AMREX_SPACEDIM > 2)
                            else {
                                mllinop_comp_interp_coef0_z
                                    (0, i, j, k           , tag.blen, tag.flo, tag.mlo,
                                     tag.bctlo, tag.bcllo, imaxorder, dzi, tag.comp);
                                mllinop_comp_interp_coef0_z
                                    (1, i, j, k+tag.blen+1, tag.blen, tag.fhi, tag.mhi,
                                     tag.bcthi, tag.bclhi, imaxorder, dzi, tag.comp);
                            }
#endif
#endif
                        }
                    });
                } else
#endif
                {
                    Vector<PSTag> tags;
                    tags.reserve(foo.local_size()*AMREX_SPACEDIM*ncomp);

                    for (MFIter mfi(foo); mfi.isValid(); ++mfi)
                    {
                        const Box& vbx = mfi.validbox();

                        const auto & bdlv = bcondloc.bndryLocs(mfi);
                        const auto & bdcv = bcondloc.bndryConds(mfi);

                        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
                        {
                            if (idim != hidden_direction) {
                                const Orientation olo(idim,Orientation::low);
                                const Orientation ohi(idim,Orientation::high);
                                for (int icomp = 0; icomp < ncomp; ++icomp) {
                                    tags.emplace_back(PSTag{undrrelxr[olo].array(mfi),
                                                            undrrelxr[ohi].array(mfi),
                                                            maskvals[olo].const_array(mfi),
                                                            maskvals[ohi].const_array(mfi),
                                                            bdlv[icomp][olo], bdlv[icomp][ohi],
                                                            amrex::adjCell(vbx,olo),
                                                            bdcv[icomp][olo], bdcv[icomp][ohi],
                                                            vbx.length(idim), icomp, idim});
                                }
                            }
                        }
                    }

                    ParallelFor(tags,
                    [=] AMREX_GPU_DEVICE (int i, int j, int k, PSTag const& tag) noexcept
                    {
                        if (tag.dir == 0)
                        {
                            mllinop_comp_interp_coef0_x
                                (0, i           , j, k, tag.blen, tag.flo, tag.mlo,
                                 tag.bctlo, tag.bcllo, imaxorder, dxi, tag.comp);
                            mllinop_comp_interp_coef0_x
                                (1, i+tag.blen+1, j, k, tag.blen, tag.fhi, tag.mhi,
                                 tag.bcthi, tag.bclhi, imaxorder, dxi, tag.comp);
                        }
#if (AMREX_SPACEDIM > 1)
                        else
#if (AMREX_SPACEDIM > 2)
                        if (tag.dir == 1)
#endif
                        {
                            mllinop_comp_interp_coef0_y
                                (0, i, j           , k, tag.blen, tag.flo, tag.mlo,
                                 tag.bctlo, tag.bcllo, imaxorder, dyi, tag.comp);
                            mllinop_comp_interp_coef0_y
                                (1, i, j+tag.blen+1, k, tag.blen, tag.fhi, tag.mhi,
                                 tag.bcthi, tag.bclhi, imaxorder, dyi, tag.comp);
                        }
#if (AMREX_SPACEDIM > 2)
                        else {
                            mllinop_comp_interp_coef0_z
                                (0, i, j, k           , tag.blen, tag.flo, tag.mlo,
                                 tag.bctlo, tag.bcllo, imaxorder, dzi, tag.comp);
                            mllinop_comp_interp_coef0_z
                                (1, i, j, k+tag.blen+1, tag.blen, tag.fhi, tag.mhi,
                                 tag.bcthi, tag.bclhi, imaxorder, dzi, tag.comp);
                        }
#endif
#endif
                    });
                }
            } else
#endif
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
                for (MFIter mfi(foo, MFItInfo{}.SetDynamic(true)); mfi.isValid(); ++mfi)
                {
                    const Box& vbx = mfi.validbox();

                    const auto & bdlv = bcondloc.bndryLocs(mfi);
                    const auto & bdcv = bcondloc.bndryConds(mfi);

#ifdef AMREX_USE_EB
                    auto fabtyp = (flags) ? (*flags)[mfi].getType(vbx) : FabType::regular;
#endif
                    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
                    {
                        if (idim == hidden_direction) continue;
                        const Orientation olo(idim,Orientation::low);
                        const Orientation ohi(idim,Orientation::high);
                        const Box blo = amrex::adjCellLo(vbx, idim);
                        const Box bhi = amrex::adjCellHi(vbx, idim);
                        const int blen = vbx.length(idim);
                        const auto& mlo = maskvals[olo].array(mfi);
                        const auto& mhi = maskvals[ohi].array(mfi);
                        const auto& flo = undrrelxr[olo].array(mfi);
                        const auto& fhi = undrrelxr[ohi].array(mfi);
                        for (int icomp = 0; icomp < ncomp; ++icomp) {
                            const BoundCond bctlo = bdcv[icomp][olo];
                            const BoundCond bcthi = bdcv[icomp][ohi];
                            const Real bcllo = bdlv[icomp][olo];
                            const Real bclhi = bdlv[icomp][ohi];
#ifdef AMREX_USE_EB
                            if (fabtyp == FabType::singlevalued) {
                                Array4<Real const> const& ap = area[idim]->const_array(mfi);
                                if (idim == 0) {
                                    mllinop_comp_interp_coef0_x_eb
                                        (0, blo, blen, flo, mlo, ap, bctlo, bcllo,
                                         imaxorder, dxi, icomp);
                                    mllinop_comp_interp_coef0_x_eb
                                        (1, bhi, blen, fhi, mhi, ap, bcthi, bclhi,
                                         imaxorder, dxi, icomp);
                                } else if (idim == 1) {
                                    mllinop_comp_interp_coef0_y_eb
                                        (0, blo, blen, flo, mlo, ap, bctlo, bcllo,
                                         imaxorder, dyi, icomp);
                                    mllinop_comp_interp_coef0_y_eb
                                        (1, bhi, blen, fhi, mhi, ap, bcthi, bclhi,
                                         imaxorder, dyi, icomp);
                                } else {
                                    mllinop_comp_interp_coef0_z_eb
                                        (0, blo, blen, flo, mlo, ap, bctlo, bcllo,
                                         imaxorder, dzi, icomp);
                                    mllinop_comp_interp_coef0_z_eb
                                        (1, bhi, blen, fhi, mhi, ap, bcthi, bclhi,
                                         imaxorder, dzi, icomp);
                                }
                            } else if (fabtyp == FabType::regular)
#endif
                            {
                                if (idim == 0) {
                                    mllinop_comp_interp_coef0_x
                                        (0, blo, blen, flo, mlo, bctlo, bcllo,
                                         imaxorder, dxi, icomp);
                                    mllinop_comp_interp_coef0_x
                                        (1, bhi, blen, fhi, mhi, bcthi, bclhi,
                                         imaxorder, dxi, icomp);
                                } else if (idim == 1) {
                                    mllinop_comp_interp_coef0_y
                                        (0, blo, blen, flo, mlo, bctlo, bcllo,
                                         imaxorder, dyi, icomp);
                                    mllinop_comp_interp_coef0_y
                                        (1, bhi, blen, fhi, mhi, bcthi, bclhi,
                                         imaxorder, dyi, icomp);
                                } else {
                                    mllinop_comp_interp_coef0_z
                                        (0, blo, blen, flo, mlo, bctlo, bcllo,
                                         imaxorder, dzi, icomp);
                                    mllinop_comp_interp_coef0_z
                                        (1, bhi, blen, fhi, mhi, bcthi, bclhi,
                                         imaxorder, dzi, icomp);
                                }
                            }
                        }
                    }
                }
            }
        }
    }
}